

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx512::CurveNvIntersectorK<8,16>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  uint uVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  byte bVar50;
  byte bVar51;
  byte bVar52;
  ulong uVar53;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong uVar54;
  byte bVar55;
  ulong uVar56;
  byte bVar57;
  ulong uVar58;
  ulong uVar59;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined8 in_R11;
  byte bVar60;
  int iVar61;
  byte bVar62;
  bool bVar63;
  undefined1 uVar64;
  undefined1 uVar65;
  ulong uVar66;
  uint uVar67;
  uint uVar130;
  uint uVar131;
  uint uVar133;
  uint uVar134;
  uint uVar135;
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  uint uVar132;
  uint uVar136;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar129 [32];
  float pp;
  float fVar137;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar153;
  float fVar154;
  undefined4 uVar155;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar220 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar221 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [32];
  undefined1 auVar224 [16];
  undefined1 auVar228 [32];
  undefined1 auVar226 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  undefined1 auVar238 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [64];
  undefined1 auVar240 [32];
  undefined1 auVar241 [64];
  undefined1 auVar242 [28];
  undefined1 auVar243 [64];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar253 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  float fVar250;
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar254 [64];
  undefined1 in_ZMM31 [64];
  vfloat<8> dOdO;
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloatx_conflict vu0;
  StackEntry stack [3];
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  RTCFilterFunctionNArguments local_ab0;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  undefined1 local_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [8];
  float fStack_8b8;
  float fStack_8b4;
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [64];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [64];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_630 [16];
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  RTCHitN local_400 [64];
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  byte abStack_1a0 [32];
  uint auStack_180 [7];
  float fStack_164;
  ulong uStack_160;
  int aiStack_158 [74];
  
  uVar53 = (ulong)(byte)prim[1];
  fVar250 = *(float *)(prim + uVar53 * 0x19 + 0x12);
  auVar70 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar70 = vinsertps_avx(auVar70,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar11 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar77 = vinsertps_avx(auVar11,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar78 = vsubps_avx(auVar70,*(undefined1 (*) [16])(prim + uVar53 * 0x19 + 6));
  fVar201 = fVar250 * auVar78._0_4_;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = *(ulong *)(prim + uVar53 * 4 + 6);
  auVar86 = vpmovsxbd_avx2(auVar70);
  fVar137 = fVar250 * auVar77._0_4_;
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar53 * 5 + 6);
  auVar84 = vpmovsxbd_avx2(auVar11);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar53 * 6 + 6);
  auVar87 = vpmovsxbd_avx2(auVar71);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar53 * 0xb + 6);
  auVar88 = vpmovsxbd_avx2(auVar72);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar68._8_8_ = 0;
  auVar68._0_8_ = *(ulong *)(prim + uVar53 * 0xc + 6);
  auVar89 = vpmovsxbd_avx2(auVar68);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar53 * 0xd + 6);
  auVar85 = vpmovsxbd_avx2(auVar76);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar53 * 0x12 + 6);
  auVar90 = vpmovsxbd_avx2(auVar73);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar69._8_8_ = 0;
  auVar69._0_8_ = *(ulong *)(prim + uVar53 * 0x13 + 6);
  auVar91 = vpmovsxbd_avx2(auVar69);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar53 * 0x14 + 6);
  auVar93 = vpmovsxbd_avx2(auVar74);
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar104._8_4_ = 1;
  auVar104._0_8_ = 0x100000001;
  auVar104._12_4_ = 1;
  auVar104._16_4_ = 1;
  auVar104._20_4_ = 1;
  auVar104._24_4_ = 1;
  auVar104._28_4_ = 1;
  auVar102._4_4_ = fVar137;
  auVar102._0_4_ = fVar137;
  auVar102._8_4_ = fVar137;
  auVar102._12_4_ = fVar137;
  auVar102._16_4_ = fVar137;
  auVar102._20_4_ = fVar137;
  auVar102._24_4_ = fVar137;
  auVar102._28_4_ = fVar137;
  auVar83 = ZEXT1632(CONCAT412(fVar250 * auVar77._12_4_,
                               CONCAT48(fVar250 * auVar77._8_4_,
                                        CONCAT44(fVar250 * auVar77._4_4_,fVar137))));
  auVar94 = vpermps_avx2(auVar104,auVar83);
  auVar81 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = vpermps_avx512vl(auVar81,auVar83);
  fVar137 = auVar82._0_4_;
  auVar152._0_4_ = fVar137 * auVar87._0_4_;
  fVar153 = auVar82._4_4_;
  auVar152._4_4_ = fVar153 * auVar87._4_4_;
  fVar166 = auVar82._8_4_;
  auVar152._8_4_ = fVar166 * auVar87._8_4_;
  fVar168 = auVar82._12_4_;
  auVar152._12_4_ = fVar168 * auVar87._12_4_;
  fVar170 = auVar82._16_4_;
  auVar152._16_4_ = fVar170 * auVar87._16_4_;
  fVar138 = auVar82._20_4_;
  auVar152._20_4_ = fVar138 * auVar87._20_4_;
  fVar172 = auVar82._24_4_;
  auVar152._28_36_ = in_ZMM4._28_36_;
  auVar152._24_4_ = fVar172 * auVar87._24_4_;
  auVar83._4_4_ = auVar85._4_4_ * fVar153;
  auVar83._0_4_ = auVar85._0_4_ * fVar137;
  auVar83._8_4_ = auVar85._8_4_ * fVar166;
  auVar83._12_4_ = auVar85._12_4_ * fVar168;
  auVar83._16_4_ = auVar85._16_4_ * fVar170;
  auVar83._20_4_ = auVar85._20_4_ * fVar138;
  auVar83._24_4_ = auVar85._24_4_ * fVar172;
  auVar83._28_4_ = auVar93._28_4_;
  auVar93._4_4_ = fVar153 * auVar92._4_4_;
  auVar93._0_4_ = fVar137 * auVar92._0_4_;
  auVar93._8_4_ = fVar166 * auVar92._8_4_;
  auVar93._12_4_ = fVar168 * auVar92._12_4_;
  auVar93._16_4_ = fVar170 * auVar92._16_4_;
  auVar93._20_4_ = fVar138 * auVar92._20_4_;
  auVar93._24_4_ = fVar172 * auVar92._24_4_;
  auVar93._28_4_ = auVar82._28_4_;
  auVar70 = vfmadd231ps_fma(auVar152._0_32_,auVar94,auVar84);
  auVar11 = vfmadd231ps_fma(auVar83,auVar94,auVar89);
  auVar71 = vfmadd231ps_fma(auVar93,auVar91,auVar94);
  auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),auVar102,auVar86);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar102,auVar88);
  auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar90,auVar102);
  auVar103._4_4_ = fVar201;
  auVar103._0_4_ = fVar201;
  auVar103._8_4_ = fVar201;
  auVar103._12_4_ = fVar201;
  auVar103._16_4_ = fVar201;
  auVar103._20_4_ = fVar201;
  auVar103._24_4_ = fVar201;
  auVar103._28_4_ = fVar201;
  auVar94 = ZEXT1632(CONCAT412(fVar250 * auVar78._12_4_,
                               CONCAT48(fVar250 * auVar78._8_4_,
                                        CONCAT44(fVar250 * auVar78._4_4_,fVar201))));
  auVar93 = vpermps_avx2(auVar104,auVar94);
  auVar83 = vpermps_avx512vl(auVar81,auVar94);
  fVar250 = auVar83._0_4_;
  fVar137 = auVar83._4_4_;
  auVar94._4_4_ = fVar137 * auVar87._4_4_;
  auVar94._0_4_ = fVar250 * auVar87._0_4_;
  fVar153 = auVar83._8_4_;
  auVar94._8_4_ = fVar153 * auVar87._8_4_;
  fVar166 = auVar83._12_4_;
  auVar94._12_4_ = fVar166 * auVar87._12_4_;
  fVar168 = auVar83._16_4_;
  auVar94._16_4_ = fVar168 * auVar87._16_4_;
  fVar170 = auVar83._20_4_;
  auVar94._20_4_ = fVar170 * auVar87._20_4_;
  fVar138 = auVar83._24_4_;
  auVar94._24_4_ = fVar138 * auVar87._24_4_;
  auVar94._28_4_ = auVar87._28_4_;
  auVar97._0_4_ = fVar250 * auVar85._0_4_;
  auVar97._4_4_ = fVar137 * auVar85._4_4_;
  auVar97._8_4_ = fVar153 * auVar85._8_4_;
  auVar97._12_4_ = fVar166 * auVar85._12_4_;
  auVar97._16_4_ = fVar168 * auVar85._16_4_;
  auVar97._20_4_ = fVar170 * auVar85._20_4_;
  auVar97._24_4_ = fVar138 * auVar85._24_4_;
  auVar97._28_4_ = 0;
  auVar85._4_4_ = fVar137 * auVar92._4_4_;
  auVar85._0_4_ = fVar250 * auVar92._0_4_;
  auVar85._8_4_ = fVar153 * auVar92._8_4_;
  auVar85._12_4_ = fVar166 * auVar92._12_4_;
  auVar85._16_4_ = fVar168 * auVar92._16_4_;
  auVar85._20_4_ = fVar170 * auVar92._20_4_;
  auVar85._24_4_ = fVar138 * auVar92._24_4_;
  auVar85._28_4_ = auVar92._28_4_;
  auVar72 = vfmadd231ps_fma(auVar94,auVar93,auVar84);
  auVar68 = vfmadd231ps_fma(auVar97,auVar93,auVar89);
  auVar76 = vfmadd231ps_fma(auVar85,auVar93,auVar91);
  auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar103,auVar86);
  auVar68 = vfmadd231ps_fma(ZEXT1632(auVar68),auVar103,auVar88);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar103,auVar90);
  auVar99._8_4_ = 0x7fffffff;
  auVar99._0_8_ = 0x7fffffff7fffffff;
  auVar99._12_4_ = 0x7fffffff;
  auVar99._16_4_ = 0x7fffffff;
  auVar99._20_4_ = 0x7fffffff;
  auVar99._24_4_ = 0x7fffffff;
  auVar99._28_4_ = 0x7fffffff;
  auVar101._8_4_ = 0x219392ef;
  auVar101._0_8_ = 0x219392ef219392ef;
  auVar101._12_4_ = 0x219392ef;
  auVar101._16_4_ = 0x219392ef;
  auVar101._20_4_ = 0x219392ef;
  auVar101._24_4_ = 0x219392ef;
  auVar101._28_4_ = 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar70),auVar99);
  uVar59 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar81._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar70._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar81._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar70._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar81._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar70._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar81._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar70._12_4_;
  auVar81._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar81._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar81._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar81._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar11),auVar99);
  uVar59 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar82._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar11._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar11._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar11._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar11._12_4_;
  auVar82._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar82._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar82._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar82._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar86 = vandps_avx(ZEXT1632(auVar71),auVar99);
  uVar59 = vcmpps_avx512vl(auVar86,auVar101,1);
  bVar63 = (bool)((byte)uVar59 & 1);
  auVar86._0_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar71._0_4_;
  bVar63 = (bool)((byte)(uVar59 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar71._4_4_;
  bVar63 = (bool)((byte)(uVar59 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar71._8_4_;
  bVar63 = (bool)((byte)(uVar59 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar63 * 0x219392ef | (uint)!bVar63 * auVar71._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar59 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar59 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar59 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar59 >> 7) * 0x219392ef;
  auVar84 = vrcp14ps_avx512vl(auVar81);
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = 0x3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar70 = vfnmadd213ps_fma(auVar81,auVar84,auVar100);
  auVar70 = vfmadd132ps_fma(ZEXT1632(auVar70),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar11 = vfnmadd213ps_fma(auVar82,auVar84,auVar100);
  auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar86);
  auVar71 = vfnmadd213ps_fma(auVar86,auVar84,auVar100);
  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar84,auVar84);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 7 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar90._4_4_ = auVar70._4_4_ * auVar86._4_4_;
  auVar90._0_4_ = auVar70._0_4_ * auVar86._0_4_;
  auVar90._8_4_ = auVar70._8_4_ * auVar86._8_4_;
  auVar90._12_4_ = auVar70._12_4_ * auVar86._12_4_;
  auVar90._16_4_ = auVar86._16_4_ * 0.0;
  auVar90._20_4_ = auVar86._20_4_ * 0.0;
  auVar90._24_4_ = auVar86._24_4_ * 0.0;
  auVar90._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 9 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar72));
  auVar98._0_4_ = auVar70._0_4_ * auVar86._0_4_;
  auVar98._4_4_ = auVar70._4_4_ * auVar86._4_4_;
  auVar98._8_4_ = auVar70._8_4_ * auVar86._8_4_;
  auVar98._12_4_ = auVar70._12_4_ * auVar86._12_4_;
  auVar98._16_4_ = auVar86._16_4_ * 0.0;
  auVar98._20_4_ = auVar86._20_4_ * 0.0;
  auVar98._24_4_ = auVar86._24_4_ * 0.0;
  auVar98._28_4_ = 0;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0xe + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar68));
  auVar91._4_4_ = auVar11._4_4_ * auVar86._4_4_;
  auVar91._0_4_ = auVar11._0_4_ * auVar86._0_4_;
  auVar91._8_4_ = auVar11._8_4_ * auVar86._8_4_;
  auVar91._12_4_ = auVar11._12_4_ * auVar86._12_4_;
  auVar91._16_4_ = auVar86._16_4_ * 0.0;
  auVar91._20_4_ = auVar86._20_4_ * 0.0;
  auVar91._24_4_ = auVar86._24_4_ * 0.0;
  auVar91._28_4_ = auVar86._28_4_;
  auVar85 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar68));
  auVar84 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0x15 + 6));
  auVar96._0_4_ = auVar11._0_4_ * auVar86._0_4_;
  auVar96._4_4_ = auVar11._4_4_ * auVar86._4_4_;
  auVar96._8_4_ = auVar11._8_4_ * auVar86._8_4_;
  auVar96._12_4_ = auVar11._12_4_ * auVar86._12_4_;
  auVar96._16_4_ = auVar86._16_4_ * 0.0;
  auVar96._20_4_ = auVar86._20_4_ * 0.0;
  auVar96._24_4_ = auVar86._24_4_ * 0.0;
  auVar96._28_4_ = 0;
  auVar86 = vcvtdq2ps_avx(auVar84);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar92._4_4_ = auVar86._4_4_ * auVar71._4_4_;
  auVar92._0_4_ = auVar86._0_4_ * auVar71._0_4_;
  auVar92._8_4_ = auVar86._8_4_ * auVar71._8_4_;
  auVar92._12_4_ = auVar86._12_4_ * auVar71._12_4_;
  auVar92._16_4_ = auVar86._16_4_ * 0.0;
  auVar92._20_4_ = auVar86._20_4_ * 0.0;
  auVar92._24_4_ = auVar86._24_4_ * 0.0;
  auVar92._28_4_ = auVar86._28_4_;
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar53 * 0x17 + 6));
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar86 = vsubps_avx(auVar86,ZEXT1632(auVar76));
  auVar95._0_4_ = auVar71._0_4_ * auVar86._0_4_;
  auVar95._4_4_ = auVar71._4_4_ * auVar86._4_4_;
  auVar95._8_4_ = auVar71._8_4_ * auVar86._8_4_;
  auVar95._12_4_ = auVar71._12_4_ * auVar86._12_4_;
  auVar95._16_4_ = auVar86._16_4_ * 0.0;
  auVar95._20_4_ = auVar86._20_4_ * 0.0;
  auVar95._24_4_ = auVar86._24_4_ * 0.0;
  auVar95._28_4_ = 0;
  auVar86 = vpminsd_avx2(auVar90,auVar98);
  auVar84 = vpminsd_avx2(auVar91,auVar96);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84 = vpminsd_avx2(auVar92,auVar95);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar87._4_4_ = uVar155;
  auVar87._0_4_ = uVar155;
  auVar87._8_4_ = uVar155;
  auVar87._12_4_ = uVar155;
  auVar87._16_4_ = uVar155;
  auVar87._20_4_ = uVar155;
  auVar87._24_4_ = uVar155;
  auVar87._28_4_ = uVar155;
  auVar84 = vmaxps_avx512vl(auVar84,auVar87);
  auVar86 = vmaxps_avx(auVar86,auVar84);
  auVar84._8_4_ = 0x3f7ffffa;
  auVar84._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar84._12_4_ = 0x3f7ffffa;
  auVar84._16_4_ = 0x3f7ffffa;
  auVar84._20_4_ = 0x3f7ffffa;
  auVar84._24_4_ = 0x3f7ffffa;
  auVar84._28_4_ = 0x3f7ffffa;
  local_5a0 = vmulps_avx512vl(auVar86,auVar84);
  auVar86 = vpmaxsd_avx2(auVar90,auVar98);
  auVar84 = vpmaxsd_avx2(auVar91,auVar96);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar84 = vpmaxsd_avx2(auVar92,auVar95);
  uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar88._4_4_ = uVar155;
  auVar88._0_4_ = uVar155;
  auVar88._8_4_ = uVar155;
  auVar88._12_4_ = uVar155;
  auVar88._16_4_ = uVar155;
  auVar88._20_4_ = uVar155;
  auVar88._24_4_ = uVar155;
  auVar88._28_4_ = uVar155;
  auVar84 = vminps_avx512vl(auVar84,auVar88);
  auVar86 = vminps_avx(auVar86,auVar84);
  auVar89._8_4_ = 0x3f800003;
  auVar89._0_8_ = 0x3f8000033f800003;
  auVar89._12_4_ = 0x3f800003;
  auVar89._16_4_ = 0x3f800003;
  auVar89._20_4_ = 0x3f800003;
  auVar89._24_4_ = 0x3f800003;
  auVar89._28_4_ = 0x3f800003;
  auVar86 = vmulps_avx512vl(auVar86,auVar89);
  uVar12 = vcmpps_avx512vl(local_5a0,auVar86,2);
  uVar14 = vpcmpgtd_avx512vl(auVar85,_DAT_01fb4ba0);
  uVar59 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar12 & (byte)uVar14));
  auVar152 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_500 = vmovdqa64_avx512f(auVar152);
LAB_019ac556:
  iVar61 = 1;
  if (uVar59 == 0) {
LAB_019aee87:
    return uVar59 != 0;
  }
  iVar15 = 0;
  for (uVar54 = uVar59; (uVar54 & 1) == 0; uVar54 = uVar54 >> 1 | 0x8000000000000000) {
    iVar15 = iVar15 + 1;
  }
  uVar58 = uVar59 - 1 & uVar59;
  uVar54 = (ulong)(uint)(iVar15 << 6);
  auVar70 = *(undefined1 (*) [16])(prim + uVar54 + uVar53 * 0x19 + 0x16);
  if (uVar58 != 0) {
    uVar56 = uVar58 - 1 & uVar58;
    for (uVar66 = uVar58; (uVar66 & 1) == 0; uVar66 = uVar66 >> 1 | 0x8000000000000000) {
    }
    if (uVar56 != 0) {
      for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar11 = *(undefined1 (*) [16])(prim + uVar54 + uVar53 * 0x19 + 0x26);
  auVar71 = *(undefined1 (*) [16])(prim + uVar54 + uVar53 * 0x19 + 0x36);
  auVar72 = *(undefined1 (*) [16])(prim + uVar54 + uVar53 * 0x19 + 0x46);
  auVar68 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x1c);
  auVar76 = vinsertps_avx(auVar68,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  local_700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x100)));
  local_720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x140)));
  auVar68 = vunpcklps_avx512vl(local_700._0_16_,local_720._0_16_);
  _local_740 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x180)));
  auVar74 = local_740._0_16_;
  local_970 = vinsertps_avx512f(auVar68,auVar74,0x28);
  auVar78._0_4_ = auVar70._0_4_ + auVar11._0_4_ + auVar71._0_4_ + auVar72._0_4_;
  auVar78._4_4_ = auVar70._4_4_ + auVar11._4_4_ + auVar71._4_4_ + auVar72._4_4_;
  auVar78._8_4_ = auVar70._8_4_ + auVar11._8_4_ + auVar71._8_4_ + auVar72._8_4_;
  auVar78._12_4_ = auVar70._12_4_ + auVar11._12_4_ + auVar71._12_4_ + auVar72._12_4_;
  auVar77._8_4_ = 0x3e800000;
  auVar77._0_8_ = 0x3e8000003e800000;
  auVar77._12_4_ = 0x3e800000;
  auVar68 = vmulps_avx512vl(auVar78,auVar77);
  auVar68 = vsubps_avx(auVar68,auVar76);
  auVar68 = vdpps_avx(auVar68,local_970,0x7f);
  fVar250 = *(float *)(ray + k * 4 + 0xc0);
  local_980 = vdpps_avx(local_970,local_970,0x7f);
  uVar1 = *(uint *)(prim + 2);
  auVar75._4_12_ = ZEXT812(0) << 0x20;
  auVar75._0_4_ = local_980._0_4_;
  auVar69 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar75);
  auVar73 = vfnmadd213ss_fma(auVar69,local_980,ZEXT416(0x40000000));
  local_580 = auVar68._0_4_ * auVar69._0_4_ * auVar73._0_4_;
  auVar230._4_4_ = local_580;
  auVar230._0_4_ = local_580;
  auVar230._8_4_ = local_580;
  auVar230._12_4_ = local_580;
  fStack_950 = local_580;
  _local_960 = auVar230;
  fStack_94c = local_580;
  fStack_948 = local_580;
  fStack_944 = local_580;
  auVar68 = vfmadd231ps_fma(auVar76,local_970,auVar230);
  auVar68 = vblendps_avx(auVar68,ZEXT816(0) << 0x40,8);
  auVar70 = vsubps_avx(auVar70,auVar68);
  auVar71 = vsubps_avx(auVar71,auVar68);
  auVar11 = vsubps_avx(auVar11,auVar68);
  auVar72 = vsubps_avx(auVar72,auVar68);
  local_9c0 = vbroadcastss_avx512vl(auVar70);
  auVar252 = ZEXT3264(local_9c0);
  auVar106._8_4_ = 1;
  auVar106._0_8_ = 0x100000001;
  auVar106._12_4_ = 1;
  auVar106._16_4_ = 1;
  auVar106._20_4_ = 1;
  auVar106._24_4_ = 1;
  auVar106._28_4_ = 1;
  local_860 = ZEXT1632(auVar70);
  local_9e0 = vpermps_avx2(auVar106,local_860);
  auVar247 = ZEXT3264(local_9e0);
  auVar107._8_4_ = 2;
  auVar107._0_8_ = 0x200000002;
  auVar107._12_4_ = 2;
  auVar107._16_4_ = 2;
  auVar107._20_4_ = 2;
  auVar107._24_4_ = 2;
  auVar107._28_4_ = 2;
  local_a00 = vpermps_avx2(auVar107,local_860);
  auVar249 = ZEXT3264(local_a00);
  auVar108._8_4_ = 3;
  auVar108._0_8_ = 0x300000003;
  auVar108._12_4_ = 3;
  auVar108._16_4_ = 3;
  auVar108._20_4_ = 3;
  auVar108._24_4_ = 3;
  auVar108._28_4_ = 3;
  local_a20 = vpermps_avx2(auVar108,local_860);
  uVar155 = auVar11._0_4_;
  local_a40._4_4_ = uVar155;
  local_a40._0_4_ = uVar155;
  local_a40._8_4_ = uVar155;
  local_a40._12_4_ = uVar155;
  local_a40._16_4_ = uVar155;
  local_a40._20_4_ = uVar155;
  local_a40._24_4_ = uVar155;
  local_a40._28_4_ = uVar155;
  auVar235 = ZEXT3264(local_a40);
  local_8a0 = ZEXT1632(auVar11);
  local_a60 = vpermps_avx2(auVar106,local_8a0);
  local_a80 = vpermps_avx2(auVar107,local_8a0);
  auVar251 = ZEXT3264(local_a80);
  auVar86 = vpermps_avx512vl(auVar108,local_8a0);
  auVar241 = ZEXT3264(local_a80);
  auVar84 = vbroadcastss_avx512vl(auVar71);
  local_880 = ZEXT1632(auVar71);
  auVar87 = vpermps_avx512vl(auVar106,local_880);
  auVar88 = vpermps_avx512vl(auVar107,local_880);
  auVar89 = vpermps_avx512vl(auVar108,local_880);
  auVar239 = ZEXT3264(local_a60);
  fVar137 = auVar72._0_4_;
  _local_8c0 = ZEXT1632(auVar72);
  auVar85 = vpermps_avx512vl(auVar106,_local_8c0);
  auVar90 = vpermps_avx512vl(auVar107,_local_8c0);
  auVar91 = vpermps_avx512vl(auVar108,_local_8c0);
  auVar70 = vmulss_avx512f(auVar74,auVar74);
  auVar92 = vfmadd231ps_avx512vl(ZEXT1632(auVar70),local_720,local_720);
  auVar92 = vfmadd231ps_avx512vl(auVar92,local_700,local_700);
  auVar92 = vbroadcastss_avx512vl(auVar92._0_16_);
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  vandps_avx512vl(auVar92,auVar105);
  local_560 = auVar92;
  local_920 = ZEXT416((uint)local_580);
  local_580 = fVar250 - local_580;
  auVar243 = ZEXT3264(local_a20);
  fStack_57c = local_580;
  fStack_578 = local_580;
  fStack_574 = local_580;
  fStack_570 = local_580;
  fStack_56c = local_580;
  fStack_568 = local_580;
  fStack_564 = local_580;
  auVar152 = vpbroadcastd_avx512f();
  local_480 = vmovdqa64_avx512f(auVar152);
  uVar54 = 0;
  bVar62 = 0;
  auVar152 = vpbroadcastd_avx512f();
  local_4c0 = vmovdqa64_avx512f(auVar152);
  auVar70 = vsqrtss_avx(local_980,local_980);
  auVar11 = vsqrtss_avx(local_980,local_980);
  local_630 = ZEXT816(0x3f80000000000000);
  auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar254 = ZEXT3264(auVar93);
  auVar152 = ZEXT3264(_DAT_01f7b040);
  do {
    auVar71 = vmovshdup_avx(local_630);
    auVar71 = vsubps_avx(auVar71,local_630);
    fVar172 = auVar71._0_4_;
    fVar138 = fVar172 * 0.04761905;
    auVar197._0_4_ = local_630._0_4_;
    auVar197._4_4_ = auVar197._0_4_;
    auVar197._8_4_ = auVar197._0_4_;
    auVar197._12_4_ = auVar197._0_4_;
    auVar197._16_4_ = auVar197._0_4_;
    auVar197._20_4_ = auVar197._0_4_;
    auVar197._24_4_ = auVar197._0_4_;
    auVar197._28_4_ = auVar197._0_4_;
    auVar79._4_4_ = fVar172;
    auVar79._0_4_ = fVar172;
    auVar79._8_4_ = fVar172;
    auVar79._12_4_ = fVar172;
    auVar214._16_4_ = fVar172;
    auVar214._0_16_ = auVar79;
    auVar214._20_4_ = fVar172;
    auVar214._24_4_ = fVar172;
    auVar214._28_4_ = fVar172;
    auVar71 = vfmadd231ps_fma(auVar197,auVar214,auVar152._0_32_);
    auVar253 = auVar254._0_32_;
    auVar93 = vsubps_avx512vl(auVar253,ZEXT1632(auVar71));
    fVar153 = auVar71._0_4_;
    fVar166 = auVar71._4_4_;
    auVar220._4_4_ = auVar235._4_4_ * fVar166;
    auVar220._0_4_ = auVar235._0_4_ * fVar153;
    fVar168 = auVar71._8_4_;
    auVar220._8_4_ = auVar235._8_4_ * fVar168;
    fVar170 = auVar71._12_4_;
    auVar220._12_4_ = auVar235._12_4_ * fVar170;
    auVar220._16_4_ = auVar235._16_4_ * 0.0;
    auVar220._20_4_ = auVar235._20_4_ * 0.0;
    auVar220._24_4_ = auVar235._24_4_ * 0.0;
    auVar220._28_4_ = auVar197._0_4_;
    auVar114._4_4_ = auVar239._4_4_ * fVar166;
    auVar114._0_4_ = auVar239._0_4_ * fVar153;
    auVar114._8_4_ = auVar239._8_4_ * fVar168;
    auVar114._12_4_ = auVar239._12_4_ * fVar170;
    auVar114._16_4_ = auVar239._16_4_ * 0.0;
    auVar114._20_4_ = auVar239._20_4_ * 0.0;
    auVar114._24_4_ = auVar239._24_4_ * 0.0;
    auVar114._28_4_ = fVar172;
    auVar222._0_4_ = auVar241._0_4_ * fVar153;
    auVar222._4_4_ = auVar241._4_4_ * fVar166;
    auVar222._8_4_ = auVar241._8_4_ * fVar168;
    auVar222._12_4_ = auVar241._12_4_ * fVar170;
    auVar222._16_4_ = auVar241._16_4_ * 0.0;
    auVar222._20_4_ = auVar241._20_4_ * 0.0;
    auVar222._28_36_ = auVar152._28_36_;
    auVar222._24_4_ = auVar241._24_4_ * 0.0;
    auVar94 = vmulps_avx512vl(auVar86,ZEXT1632(auVar71));
    auVar83 = vfmadd231ps_avx512vl(auVar220,auVar93,auVar252._0_32_);
    auVar72 = vfmadd231ps_fma(auVar114,auVar93,auVar247._0_32_);
    auVar68 = vfmadd231ps_fma(auVar222._0_32_,auVar93,auVar249._0_32_);
    auVar76 = vfmadd231ps_fma(auVar94,auVar93,auVar243._0_32_);
    auVar94 = vmulps_avx512vl(auVar84,ZEXT1632(auVar71));
    auVar97 = ZEXT1632(auVar71);
    auVar81 = vmulps_avx512vl(auVar87,auVar97);
    auVar82 = vmulps_avx512vl(auVar88,auVar97);
    auVar95 = vmulps_avx512vl(auVar89,auVar97);
    auVar73 = vfmadd231ps_fma(auVar94,auVar93,auVar235._0_32_);
    auVar69 = vfmadd231ps_fma(auVar81,auVar93,auVar239._0_32_);
    auVar74 = vfmadd231ps_fma(auVar82,auVar93,auVar241._0_32_);
    auVar94 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar86);
    auVar115._4_4_ = fVar137 * fVar166;
    auVar115._0_4_ = fVar137 * fVar153;
    auVar115._8_4_ = fVar137 * fVar168;
    auVar115._12_4_ = fVar137 * fVar170;
    auVar115._16_4_ = fVar137 * 0.0;
    auVar115._20_4_ = fVar137 * 0.0;
    auVar115._24_4_ = fVar137 * 0.0;
    auVar115._28_4_ = auVar235._28_4_;
    auVar81 = vmulps_avx512vl(auVar85,auVar97);
    auVar82 = vmulps_avx512vl(auVar90,auVar97);
    auVar95 = vmulps_avx512vl(auVar91,auVar97);
    auVar96 = vfmadd231ps_avx512vl(auVar115,auVar93,auVar84);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar93,auVar87);
    auVar82 = vfmadd231ps_avx512vl(auVar82,auVar93,auVar88);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar93,auVar89);
    auVar235._28_36_ = auVar251._28_36_;
    auVar235._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar73._12_4_,
                            CONCAT48(fVar168 * auVar73._8_4_,
                                     CONCAT44(fVar166 * auVar73._4_4_,fVar153 * auVar73._0_4_))));
    auVar97 = vmulps_avx512vl(auVar97,ZEXT1632(auVar69));
    auVar98 = vmulps_avx512vl(ZEXT1632(auVar71),ZEXT1632(auVar74));
    auVar99 = vmulps_avx512vl(ZEXT1632(auVar71),auVar94);
    auVar71 = vfmadd231ps_fma(auVar235._0_32_,auVar93,auVar83);
    auVar97 = vfmadd231ps_avx512vl(auVar97,auVar93,ZEXT1632(auVar72));
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar93,ZEXT1632(auVar68));
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar93,ZEXT1632(auVar76));
    auVar233._0_4_ = auVar96._0_4_ * fVar153;
    auVar233._4_4_ = auVar96._4_4_ * fVar166;
    auVar233._8_4_ = auVar96._8_4_ * fVar168;
    auVar233._12_4_ = auVar96._12_4_ * fVar170;
    auVar233._16_4_ = auVar96._16_4_ * 0.0;
    auVar233._20_4_ = auVar96._20_4_ * 0.0;
    auVar233._24_4_ = auVar96._24_4_ * 0.0;
    auVar233._28_4_ = 0;
    auVar116._4_4_ = auVar81._4_4_ * fVar166;
    auVar116._0_4_ = auVar81._0_4_ * fVar153;
    auVar116._8_4_ = auVar81._8_4_ * fVar168;
    auVar116._12_4_ = auVar81._12_4_ * fVar170;
    auVar116._16_4_ = auVar81._16_4_ * 0.0;
    auVar116._20_4_ = auVar81._20_4_ * 0.0;
    auVar116._24_4_ = auVar81._24_4_ * 0.0;
    auVar116._28_4_ = auVar96._28_4_;
    auVar119._4_4_ = auVar82._4_4_ * fVar166;
    auVar119._0_4_ = auVar82._0_4_ * fVar153;
    auVar119._8_4_ = auVar82._8_4_ * fVar168;
    auVar119._12_4_ = auVar82._12_4_ * fVar170;
    auVar119._16_4_ = auVar82._16_4_ * 0.0;
    auVar119._20_4_ = auVar82._20_4_ * 0.0;
    auVar119._24_4_ = auVar82._24_4_ * 0.0;
    auVar119._28_4_ = auVar81._28_4_;
    auVar120._4_4_ = auVar95._4_4_ * fVar166;
    auVar120._0_4_ = auVar95._0_4_ * fVar153;
    auVar120._8_4_ = auVar95._8_4_ * fVar168;
    auVar120._12_4_ = auVar95._12_4_ * fVar170;
    auVar120._16_4_ = auVar95._16_4_ * 0.0;
    auVar120._20_4_ = auVar95._20_4_ * 0.0;
    auVar120._24_4_ = auVar95._24_4_ * 0.0;
    auVar120._28_4_ = auVar82._28_4_;
    auVar72 = vfmadd231ps_fma(auVar233,auVar93,ZEXT1632(auVar73));
    auVar68 = vfmadd231ps_fma(auVar116,auVar93,ZEXT1632(auVar69));
    auVar76 = vfmadd231ps_fma(auVar119,auVar93,ZEXT1632(auVar74));
    auVar73 = vfmadd231ps_fma(auVar120,auVar93,auVar94);
    auVar33._28_4_ = auVar83._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(auVar76._12_4_ * fVar170,
                            CONCAT48(auVar76._8_4_ * fVar168,
                                     CONCAT44(auVar76._4_4_ * fVar166,auVar76._0_4_ * fVar153))));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar72._12_4_,
                                                 CONCAT48(fVar168 * auVar72._8_4_,
                                                          CONCAT44(fVar166 * auVar72._4_4_,
                                                                   fVar153 * auVar72._0_4_)))),
                              auVar93,ZEXT1632(auVar71));
    auVar96 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar68._12_4_ * fVar170,
                                            CONCAT48(auVar68._8_4_ * fVar168,
                                                     CONCAT44(auVar68._4_4_ * fVar166,
                                                              auVar68._0_4_ * fVar153)))),auVar93,
                         auVar97);
    auVar100 = vfmadd231ps_avx512vl(auVar33,auVar93,auVar98);
    auVar94 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar73._12_4_ * fVar170,
                                            CONCAT48(auVar73._8_4_ * fVar168,
                                                     CONCAT44(auVar73._4_4_ * fVar166,
                                                              auVar73._0_4_ * fVar153)))),auVar99,
                         auVar93);
    auVar93 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar71));
    auVar83 = vsubps_avx512vl(ZEXT1632(auVar68),auVar97);
    auVar81 = vsubps_avx512vl(ZEXT1632(auVar76),auVar98);
    auVar82 = vsubps_avx512vl(ZEXT1632(auVar73),auVar99);
    auVar244._0_4_ = fVar138 * auVar93._0_4_ * 3.0;
    auVar244._4_4_ = fVar138 * auVar93._4_4_ * 3.0;
    auVar244._8_4_ = fVar138 * auVar93._8_4_ * 3.0;
    auVar244._12_4_ = fVar138 * auVar93._12_4_ * 3.0;
    auVar244._16_4_ = fVar138 * auVar93._16_4_ * 3.0;
    auVar244._20_4_ = fVar138 * auVar93._20_4_ * 3.0;
    auVar244._24_4_ = fVar138 * auVar93._24_4_ * 3.0;
    auVar244._28_4_ = 0;
    auVar248._0_4_ = fVar138 * auVar83._0_4_ * 3.0;
    auVar248._4_4_ = fVar138 * auVar83._4_4_ * 3.0;
    auVar248._8_4_ = fVar138 * auVar83._8_4_ * 3.0;
    auVar248._12_4_ = fVar138 * auVar83._12_4_ * 3.0;
    auVar248._16_4_ = fVar138 * auVar83._16_4_ * 3.0;
    auVar248._20_4_ = fVar138 * auVar83._20_4_ * 3.0;
    auVar248._24_4_ = fVar138 * auVar83._24_4_ * 3.0;
    auVar248._28_4_ = 0;
    auVar34._4_4_ = fVar138 * auVar81._4_4_ * 3.0;
    auVar34._0_4_ = fVar138 * auVar81._0_4_ * 3.0;
    auVar34._8_4_ = fVar138 * auVar81._8_4_ * 3.0;
    auVar34._12_4_ = fVar138 * auVar81._12_4_ * 3.0;
    auVar34._16_4_ = fVar138 * auVar81._16_4_ * 3.0;
    auVar34._20_4_ = fVar138 * auVar81._20_4_ * 3.0;
    auVar34._24_4_ = fVar138 * auVar81._24_4_ * 3.0;
    auVar34._28_4_ = auVar95._28_4_;
    fVar153 = auVar82._0_4_ * 3.0 * fVar138;
    fVar166 = auVar82._4_4_ * 3.0 * fVar138;
    auVar35._4_4_ = fVar166;
    auVar35._0_4_ = fVar153;
    fVar168 = auVar82._8_4_ * 3.0 * fVar138;
    auVar35._8_4_ = fVar168;
    fVar170 = auVar82._12_4_ * 3.0 * fVar138;
    auVar35._12_4_ = fVar170;
    fVar172 = auVar82._16_4_ * 3.0 * fVar138;
    auVar35._16_4_ = fVar172;
    fVar201 = auVar82._20_4_ * 3.0 * fVar138;
    auVar35._20_4_ = fVar201;
    fVar175 = auVar82._24_4_ * 3.0 * fVar138;
    auVar35._24_4_ = fVar175;
    auVar35._28_4_ = fVar138;
    auVar71 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar71);
    auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar69),_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar97 = vpermt2ps_avx512vl(auVar96,_DAT_01fb9fc0,ZEXT1632(auVar71));
    auVar83 = ZEXT1632(auVar71);
    auVar98 = vpermt2ps_avx512vl(auVar100,_DAT_01fb9fc0,auVar83);
    auVar227._0_4_ = auVar94._0_4_ + fVar153;
    auVar227._4_4_ = auVar94._4_4_ + fVar166;
    auVar227._8_4_ = auVar94._8_4_ + fVar168;
    auVar227._12_4_ = auVar94._12_4_ + fVar170;
    auVar227._16_4_ = auVar94._16_4_ + fVar172;
    auVar227._20_4_ = auVar94._20_4_ + fVar201;
    auVar227._24_4_ = auVar94._24_4_ + fVar175;
    auVar227._28_4_ = auVar94._28_4_ + fVar138;
    auVar93 = vmaxps_avx(auVar94,auVar227);
    auVar99 = vminps_avx512vl(auVar94,auVar227);
    auVar101 = vpermt2ps_avx512vl(auVar94,_DAT_01fb9fc0,auVar83);
    auVar102 = vpermt2ps_avx512vl(auVar244,_DAT_01fb9fc0,auVar83);
    auVar103 = vpermt2ps_avx512vl(auVar248,_DAT_01fb9fc0,auVar83);
    auVar114 = ZEXT1632(auVar71);
    auVar104 = vpermt2ps_avx512vl(auVar34,_DAT_01fb9fc0,auVar114);
    auVar94 = vpermt2ps_avx512vl(auVar35,_DAT_01fb9fc0,auVar114);
    auVar94 = vsubps_avx(auVar101,auVar94);
    auVar83 = vsubps_avx(auVar95,ZEXT1632(auVar69));
    auVar81 = vsubps_avx(auVar97,auVar96);
    auVar82 = vsubps_avx(auVar98,auVar100);
    auVar105 = vmulps_avx512vl(auVar81,auVar34);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar248,auVar82);
    auVar106 = vmulps_avx512vl(auVar82,auVar244);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar34,auVar83);
    auVar107 = vmulps_avx512vl(auVar83,auVar248);
    auVar107 = vfmsub231ps_avx512vl(auVar107,auVar244,auVar81);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar106 = vfmadd231ps_avx512vl(auVar107,auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar82,auVar82);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar81,auVar81);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar83,auVar83);
    auVar107 = vrcp14ps_avx512vl(auVar106);
    auVar108 = vfnmadd213ps_avx512vl(auVar107,auVar106,auVar253);
    auVar107 = vfmadd132ps_avx512vl(auVar108,auVar107,auVar107);
    auVar105 = vmulps_avx512vl(auVar105,auVar107);
    auVar108 = vmulps_avx512vl(auVar81,auVar104);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar103,auVar82);
    auVar109 = vmulps_avx512vl(auVar82,auVar102);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar104,auVar83);
    auVar110 = vmulps_avx512vl(auVar83,auVar103);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar102,auVar81);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar107 = vmulps_avx512vl(auVar108,auVar107);
    auVar105 = vmaxps_avx512vl(auVar105,auVar107);
    auVar105 = vsqrtps_avx512vl(auVar105);
    auVar107 = vmaxps_avx512vl(auVar94,auVar101);
    auVar93 = vmaxps_avx512vl(auVar93,auVar107);
    auVar107 = vaddps_avx512vl(auVar105,auVar93);
    auVar93 = vminps_avx(auVar94,auVar101);
    auVar93 = vminps_avx512vl(auVar99,auVar93);
    auVar93 = vsubps_avx512vl(auVar93,auVar105);
    auVar109._8_4_ = 0x3f800002;
    auVar109._0_8_ = 0x3f8000023f800002;
    auVar109._12_4_ = 0x3f800002;
    auVar109._16_4_ = 0x3f800002;
    auVar109._20_4_ = 0x3f800002;
    auVar109._24_4_ = 0x3f800002;
    auVar109._28_4_ = 0x3f800002;
    auVar94 = vmulps_avx512vl(auVar107,auVar109);
    auVar110._8_4_ = 0x3f7ffffc;
    auVar110._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar110._12_4_ = 0x3f7ffffc;
    auVar110._16_4_ = 0x3f7ffffc;
    auVar110._20_4_ = 0x3f7ffffc;
    auVar110._24_4_ = 0x3f7ffffc;
    auVar110._28_4_ = 0x3f7ffffc;
    auVar93 = vmulps_avx512vl(auVar93,auVar110);
    auVar94 = vmulps_avx512vl(auVar94,auVar94);
    auVar99 = vrsqrt14ps_avx512vl(auVar106);
    auVar111._8_4_ = 0xbf000000;
    auVar111._0_8_ = 0xbf000000bf000000;
    auVar111._12_4_ = 0xbf000000;
    auVar111._16_4_ = 0xbf000000;
    auVar111._20_4_ = 0xbf000000;
    auVar111._24_4_ = 0xbf000000;
    auVar111._28_4_ = 0xbf000000;
    auVar101 = vmulps_avx512vl(auVar106,auVar111);
    fVar153 = auVar99._0_4_;
    fVar166 = auVar99._4_4_;
    fVar168 = auVar99._8_4_;
    fVar170 = auVar99._12_4_;
    fVar138 = auVar99._16_4_;
    fVar172 = auVar99._20_4_;
    fVar201 = auVar99._24_4_;
    auVar36._4_4_ = fVar166 * fVar166 * fVar166 * auVar101._4_4_;
    auVar36._0_4_ = fVar153 * fVar153 * fVar153 * auVar101._0_4_;
    auVar36._8_4_ = fVar168 * fVar168 * fVar168 * auVar101._8_4_;
    auVar36._12_4_ = fVar170 * fVar170 * fVar170 * auVar101._12_4_;
    auVar36._16_4_ = fVar138 * fVar138 * fVar138 * auVar101._16_4_;
    auVar36._20_4_ = fVar172 * fVar172 * fVar172 * auVar101._20_4_;
    auVar36._24_4_ = fVar201 * fVar201 * fVar201 * auVar101._24_4_;
    auVar36._28_4_ = auVar107._28_4_;
    auVar112._8_4_ = 0x3fc00000;
    auVar112._0_8_ = 0x3fc000003fc00000;
    auVar112._12_4_ = 0x3fc00000;
    auVar112._16_4_ = 0x3fc00000;
    auVar112._20_4_ = 0x3fc00000;
    auVar112._24_4_ = 0x3fc00000;
    auVar112._28_4_ = 0x3fc00000;
    auVar99 = vfmadd231ps_avx512vl(auVar36,auVar99,auVar112);
    auVar251 = ZEXT3264(auVar99);
    auVar101 = vmulps_avx512vl(auVar83,auVar99);
    auVar105 = vmulps_avx512vl(auVar81,auVar99);
    auVar106 = vmulps_avx512vl(auVar82,auVar99);
    auVar220 = ZEXT1632(auVar69);
    auVar107 = vsubps_avx512vl(auVar114,auVar220);
    auVar108 = vsubps_avx512vl(auVar114,auVar96);
    auVar109 = vsubps_avx512vl(auVar114,auVar100);
    auVar110 = vmulps_avx512vl(_local_740,auVar109);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_720,auVar108);
    auVar110 = vfmadd231ps_avx512vl(auVar110,local_700,auVar107);
    auVar111 = vmulps_avx512vl(auVar109,auVar109);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar108);
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar107,auVar107);
    auVar112 = vmulps_avx512vl(_local_740,auVar106);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar105,local_720);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar101,local_700);
    auVar106 = vmulps_avx512vl(auVar109,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar108,auVar105);
    auVar101 = vfmadd231ps_avx512vl(auVar105,auVar107,auVar101);
    auVar105 = vmulps_avx512vl(auVar112,auVar112);
    auVar106 = vsubps_avx512vl(auVar92,auVar105);
    auVar113 = vmulps_avx512vl(auVar112,auVar101);
    auVar110 = vsubps_avx512vl(auVar110,auVar113);
    auVar110 = vaddps_avx512vl(auVar110,auVar110);
    auVar113 = vmulps_avx512vl(auVar101,auVar101);
    auVar111 = vsubps_avx512vl(auVar111,auVar113);
    auVar94 = vsubps_avx512vl(auVar111,auVar94);
    local_7a0 = vmulps_avx512vl(auVar110,auVar110);
    auVar113._8_4_ = 0x40800000;
    auVar113._0_8_ = 0x4080000040800000;
    auVar113._12_4_ = 0x40800000;
    auVar113._16_4_ = 0x40800000;
    auVar113._20_4_ = 0x40800000;
    auVar113._24_4_ = 0x40800000;
    auVar113._28_4_ = 0x40800000;
    _local_7c0 = vmulps_avx512vl(auVar106,auVar113);
    auVar113 = vmulps_avx512vl(_local_7c0,auVar94);
    auVar113 = vsubps_avx512vl(local_7a0,auVar113);
    uVar66 = vcmpps_avx512vl(auVar113,auVar114,5);
    bVar50 = (byte)uVar66;
    fVar153 = (float)local_960._0_4_;
    fVar166 = (float)local_960._4_4_;
    fVar168 = fStack_958;
    fVar170 = fStack_954;
    fVar138 = fStack_950;
    fVar172 = fStack_94c;
    fVar201 = fStack_948;
    fVar175 = fStack_944;
    if (bVar50 == 0) {
LAB_019ad252:
      auVar152 = ZEXT3264(_DAT_01f7b040);
      auVar252 = ZEXT3264(local_9c0);
      auVar247 = ZEXT3264(local_9e0);
      auVar249 = ZEXT3264(local_a00);
      auVar243 = ZEXT3264(local_a20);
      auVar235 = ZEXT3264(local_a40);
      auVar239 = ZEXT3264(local_a60);
      auVar241 = ZEXT3264(local_a80);
    }
    else {
      local_780._0_32_ = auVar111;
      auVar113 = vsqrtps_avx512vl(auVar113);
      auVar114 = vaddps_avx512vl(auVar106,auVar106);
      local_840 = vrcp14ps_avx512vl(auVar114);
      in_ZMM31 = ZEXT3264(local_840);
      auVar115 = vfnmadd213ps_avx512vl(local_840,auVar114,auVar253);
      auVar115 = vfmadd132ps_avx512vl(auVar115,local_840,local_840);
      auVar253._8_4_ = 0x80000000;
      auVar253._0_8_ = 0x8000000080000000;
      auVar253._12_4_ = 0x80000000;
      auVar253._16_4_ = 0x80000000;
      auVar253._20_4_ = 0x80000000;
      auVar253._24_4_ = 0x80000000;
      auVar253._28_4_ = 0x80000000;
      local_7e0 = vxorps_avx512vl(auVar110,auVar253);
      auVar116 = vsubps_avx512vl(local_7e0,auVar113);
      local_940 = vmulps_avx512vl(auVar116,auVar115);
      auVar113 = vsubps_avx512vl(auVar113,auVar110);
      local_9a0 = vmulps_avx512vl(auVar113,auVar115);
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar115 = vblendmps_avx512vl(auVar113,local_940);
      auVar117._0_4_ =
           (uint)(bVar50 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar113._0_4_;
      bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar117._4_4_ = (uint)bVar63 * auVar115._4_4_ | (uint)!bVar63 * auVar113._4_4_;
      bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar117._8_4_ = (uint)bVar63 * auVar115._8_4_ | (uint)!bVar63 * auVar113._8_4_;
      bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar117._12_4_ = (uint)bVar63 * auVar115._12_4_ | (uint)!bVar63 * auVar113._12_4_;
      bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar117._16_4_ = (uint)bVar63 * auVar115._16_4_ | (uint)!bVar63 * auVar113._16_4_;
      bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar117._20_4_ = (uint)bVar63 * auVar115._20_4_ | (uint)!bVar63 * auVar113._20_4_;
      bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar117._24_4_ = (uint)bVar63 * auVar115._24_4_ | (uint)!bVar63 * auVar113._24_4_;
      bVar63 = SUB81(uVar66 >> 7,0);
      auVar117._28_4_ = (uint)bVar63 * auVar115._28_4_ | (uint)!bVar63 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar113,local_9a0);
      auVar118._0_4_ =
           (uint)(bVar50 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar50 & 1) * auVar113._0_4_;
      bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
      auVar118._4_4_ = (uint)bVar63 * auVar115._4_4_ | (uint)!bVar63 * auVar113._4_4_;
      bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
      auVar118._8_4_ = (uint)bVar63 * auVar115._8_4_ | (uint)!bVar63 * auVar113._8_4_;
      bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
      auVar118._12_4_ = (uint)bVar63 * auVar115._12_4_ | (uint)!bVar63 * auVar113._12_4_;
      bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
      auVar118._16_4_ = (uint)bVar63 * auVar115._16_4_ | (uint)!bVar63 * auVar113._16_4_;
      bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
      auVar118._20_4_ = (uint)bVar63 * auVar115._20_4_ | (uint)!bVar63 * auVar113._20_4_;
      bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
      auVar118._24_4_ = (uint)bVar63 * auVar115._24_4_ | (uint)!bVar63 * auVar113._24_4_;
      bVar63 = SUB81(uVar66 >> 7,0);
      auVar118._28_4_ = (uint)bVar63 * auVar115._28_4_ | (uint)!bVar63 * auVar113._28_4_;
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar105,auVar113);
      local_800 = vmaxps_avx512vl(local_560,auVar113);
      auVar26._8_4_ = 0x36000000;
      auVar26._0_8_ = 0x3600000036000000;
      auVar26._12_4_ = 0x36000000;
      auVar26._16_4_ = 0x36000000;
      auVar26._20_4_ = 0x36000000;
      auVar26._24_4_ = 0x36000000;
      auVar26._28_4_ = 0x36000000;
      local_820 = vmulps_avx512vl(local_800,auVar26);
      vandps_avx512vl(auVar106,auVar113);
      uVar56 = vcmpps_avx512vl(local_820,local_820,1);
      uVar66 = uVar66 & uVar56;
      bVar60 = (byte)uVar66;
      if (bVar60 != 0) {
        uVar56 = vcmpps_avx512vl(auVar94,_DAT_01f7b000,2);
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar105 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar106 = vblendmps_avx512vl(auVar94,auVar105);
        bVar55 = (byte)uVar56;
        uVar67 = (uint)(bVar55 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar55 & 1) * local_820._0_4_;
        bVar63 = (bool)((byte)(uVar56 >> 1) & 1);
        uVar130 = (uint)bVar63 * auVar106._4_4_ | (uint)!bVar63 * local_820._4_4_;
        bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
        uVar131 = (uint)bVar63 * auVar106._8_4_ | (uint)!bVar63 * local_820._8_4_;
        bVar63 = (bool)((byte)(uVar56 >> 3) & 1);
        uVar132 = (uint)bVar63 * auVar106._12_4_ | (uint)!bVar63 * local_820._12_4_;
        bVar63 = (bool)((byte)(uVar56 >> 4) & 1);
        uVar133 = (uint)bVar63 * auVar106._16_4_ | (uint)!bVar63 * local_820._16_4_;
        bVar63 = (bool)((byte)(uVar56 >> 5) & 1);
        uVar134 = (uint)bVar63 * auVar106._20_4_ | (uint)!bVar63 * local_820._20_4_;
        bVar63 = (bool)((byte)(uVar56 >> 6) & 1);
        uVar135 = (uint)bVar63 * auVar106._24_4_ | (uint)!bVar63 * local_820._24_4_;
        bVar63 = SUB81(uVar56 >> 7,0);
        uVar136 = (uint)bVar63 * auVar106._28_4_ | (uint)!bVar63 * local_820._28_4_;
        auVar117._0_4_ = (bVar60 & 1) * uVar67 | !(bool)(bVar60 & 1) * auVar117._0_4_;
        bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar117._4_4_ = bVar63 * uVar130 | !bVar63 * auVar117._4_4_;
        bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar117._8_4_ = bVar63 * uVar131 | !bVar63 * auVar117._8_4_;
        bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar117._12_4_ = bVar63 * uVar132 | !bVar63 * auVar117._12_4_;
        bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar117._16_4_ = bVar63 * uVar133 | !bVar63 * auVar117._16_4_;
        bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar117._20_4_ = bVar63 * uVar134 | !bVar63 * auVar117._20_4_;
        bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar117._24_4_ = bVar63 * uVar135 | !bVar63 * auVar117._24_4_;
        bVar63 = SUB81(uVar66 >> 7,0);
        auVar117._28_4_ = bVar63 * uVar136 | !bVar63 * auVar117._28_4_;
        auVar94 = vblendmps_avx512vl(auVar105,auVar94);
        bVar63 = (bool)((byte)(uVar56 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar56 >> 2) & 1);
        bVar6 = (bool)((byte)(uVar56 >> 3) & 1);
        bVar7 = (bool)((byte)(uVar56 >> 4) & 1);
        bVar8 = (bool)((byte)(uVar56 >> 5) & 1);
        bVar9 = (bool)((byte)(uVar56 >> 6) & 1);
        bVar10 = SUB81(uVar56 >> 7,0);
        auVar118._0_4_ =
             (uint)(bVar60 & 1) *
             ((uint)(bVar55 & 1) * auVar94._0_4_ | !(bool)(bVar55 & 1) * uVar67) |
             !(bool)(bVar60 & 1) * auVar118._0_4_;
        bVar4 = (bool)((byte)(uVar66 >> 1) & 1);
        auVar118._4_4_ =
             (uint)bVar4 * ((uint)bVar63 * auVar94._4_4_ | !bVar63 * uVar130) |
             !bVar4 * auVar118._4_4_;
        bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
        auVar118._8_4_ =
             (uint)bVar63 * ((uint)bVar5 * auVar94._8_4_ | !bVar5 * uVar131) |
             !bVar63 * auVar118._8_4_;
        bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
        auVar118._12_4_ =
             (uint)bVar63 * ((uint)bVar6 * auVar94._12_4_ | !bVar6 * uVar132) |
             !bVar63 * auVar118._12_4_;
        bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
        auVar118._16_4_ =
             (uint)bVar63 * ((uint)bVar7 * auVar94._16_4_ | !bVar7 * uVar133) |
             !bVar63 * auVar118._16_4_;
        bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
        auVar118._20_4_ =
             (uint)bVar63 * ((uint)bVar8 * auVar94._20_4_ | !bVar8 * uVar134) |
             !bVar63 * auVar118._20_4_;
        bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
        auVar118._24_4_ =
             (uint)bVar63 * ((uint)bVar9 * auVar94._24_4_ | !bVar9 * uVar135) |
             !bVar63 * auVar118._24_4_;
        bVar63 = SUB81(uVar66 >> 7,0);
        auVar118._28_4_ =
             (uint)bVar63 * ((uint)bVar10 * auVar94._28_4_ | !bVar10 * uVar136) |
             !bVar63 * auVar118._28_4_;
        bVar50 = (~bVar60 | bVar55) & bVar50;
      }
      if ((bVar50 & 0x7f) == 0) {
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar254 = ZEXT3264(auVar93);
        auVar152 = ZEXT3264(_DAT_01f7b040);
        auVar252 = ZEXT3264(local_9c0);
        auVar247 = ZEXT3264(local_9e0);
        auVar249 = ZEXT3264(local_a00);
        auVar243 = ZEXT3264(local_a20);
        auVar235 = ZEXT3264(local_a40);
        auVar239 = ZEXT3264(local_a60);
        auVar241 = ZEXT3264(local_a80);
      }
      else {
        auVar94 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar104 = vxorps_avx512vl(auVar104,auVar94);
        auVar102 = vxorps_avx512vl(auVar102,auVar94);
        auVar152 = ZEXT464(*(uint *)(ray + k * 4 + 0x200));
        auVar103 = vxorps_avx512vl(auVar103,auVar94);
        auVar71 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x200)),
                                 ZEXT416((uint)local_920._0_4_));
        auVar105 = vbroadcastss_avx512vl(auVar71);
        auVar105 = vminps_avx512vl(auVar105,auVar118);
        auVar49._4_4_ = fStack_57c;
        auVar49._0_4_ = local_580;
        auVar49._8_4_ = fStack_578;
        auVar49._12_4_ = fStack_574;
        auVar49._16_4_ = fStack_570;
        auVar49._20_4_ = fStack_56c;
        auVar49._24_4_ = fStack_568;
        auVar49._28_4_ = fStack_564;
        auVar106 = vmaxps_avx512vl(auVar49,auVar117);
        auVar109 = vmulps_avx512vl(auVar109,auVar34);
        auVar108 = vfmadd213ps_avx512vl(auVar108,auVar248,auVar109);
        auVar71 = vfmadd213ps_fma(auVar107,auVar244,auVar108);
        in_ZMM31 = ZEXT3264(_local_740);
        auVar107 = vmulps_avx512vl(_local_740,auVar34);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_720,auVar248);
        auVar107 = vfmadd231ps_avx512vl(auVar107,local_700,auVar244);
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar107,auVar108);
        auVar109 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar12 = vcmpps_avx512vl(auVar108,auVar109,1);
        auVar113 = vxorps_avx512vl(ZEXT1632(auVar71),auVar94);
        auVar115 = vrcp14ps_avx512vl(auVar107);
        auVar116 = vxorps_avx512vl(auVar107,auVar94);
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar120 = vfnmadd213ps_avx512vl(auVar115,auVar107,auVar119);
        auVar71 = vfmadd132ps_fma(auVar120,auVar115,auVar115);
        fVar154 = auVar71._0_4_ * auVar113._0_4_;
        fVar167 = auVar71._4_4_ * auVar113._4_4_;
        auVar37._4_4_ = fVar167;
        auVar37._0_4_ = fVar154;
        fVar169 = auVar71._8_4_ * auVar113._8_4_;
        auVar37._8_4_ = fVar169;
        fVar171 = auVar71._12_4_ * auVar113._12_4_;
        auVar37._12_4_ = fVar171;
        fVar173 = auVar113._16_4_ * 0.0;
        auVar37._16_4_ = fVar173;
        fVar174 = auVar113._20_4_ * 0.0;
        auVar37._20_4_ = fVar174;
        fVar176 = auVar113._24_4_ * 0.0;
        auVar37._24_4_ = fVar176;
        auVar37._28_4_ = auVar113._28_4_;
        uVar14 = vcmpps_avx512vl(auVar107,auVar116,1);
        bVar60 = (byte)uVar12 | (byte)uVar14;
        auVar245._8_4_ = 0xff800000;
        auVar245._0_8_ = 0xff800000ff800000;
        auVar245._12_4_ = 0xff800000;
        auVar245._16_4_ = 0xff800000;
        auVar245._20_4_ = 0xff800000;
        auVar245._24_4_ = 0xff800000;
        auVar245._28_4_ = 0xff800000;
        auVar115 = vblendmps_avx512vl(auVar37,auVar245);
        auVar121._0_4_ = (uint)(bVar60 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar60 & 1) * -0x800000
        ;
        bVar63 = (bool)(bVar60 >> 1 & 1);
        auVar121._4_4_ = (uint)bVar63 * auVar115._4_4_ | (uint)!bVar63 * -0x800000;
        bVar63 = (bool)(bVar60 >> 2 & 1);
        auVar121._8_4_ = (uint)bVar63 * auVar115._8_4_ | (uint)!bVar63 * -0x800000;
        bVar63 = (bool)(bVar60 >> 3 & 1);
        auVar121._12_4_ = (uint)bVar63 * auVar115._12_4_ | (uint)!bVar63 * -0x800000;
        bVar63 = (bool)(bVar60 >> 4 & 1);
        auVar121._16_4_ = (uint)bVar63 * auVar115._16_4_ | (uint)!bVar63 * -0x800000;
        bVar63 = (bool)(bVar60 >> 5 & 1);
        auVar121._20_4_ = (uint)bVar63 * auVar115._20_4_ | (uint)!bVar63 * -0x800000;
        bVar63 = (bool)(bVar60 >> 6 & 1);
        auVar121._24_4_ = (uint)bVar63 * auVar115._24_4_ | (uint)!bVar63 * -0x800000;
        auVar121._28_4_ =
             (uint)(bVar60 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar60 >> 7) * -0x800000;
        auVar115 = vmaxps_avx512vl(auVar106,auVar121);
        uVar14 = vcmpps_avx512vl(auVar107,auVar116,6);
        bVar60 = (byte)uVar12 | (byte)uVar14;
        auVar122._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar154;
        bVar63 = (bool)(bVar60 >> 1 & 1);
        auVar122._4_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar167;
        bVar63 = (bool)(bVar60 >> 2 & 1);
        auVar122._8_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar169;
        bVar63 = (bool)(bVar60 >> 3 & 1);
        auVar122._12_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar171;
        bVar63 = (bool)(bVar60 >> 4 & 1);
        auVar122._16_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar173;
        bVar63 = (bool)(bVar60 >> 5 & 1);
        auVar122._20_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar174;
        bVar63 = (bool)(bVar60 >> 6 & 1);
        auVar122._24_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar176;
        auVar122._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar113._28_4_;
        auVar105 = vminps_avx512vl(auVar105,auVar122);
        auVar71 = vxorps_avx512vl(auVar106._0_16_,auVar106._0_16_);
        auVar95 = vsubps_avx512vl(ZEXT1632(auVar71),auVar95);
        auVar97 = vsubps_avx512vl(ZEXT1632(auVar71),auVar97);
        auVar106 = ZEXT1632(auVar71);
        auVar98 = vsubps_avx512vl(auVar106,auVar98);
        auVar98 = vmulps_avx512vl(auVar98,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar98,auVar103,auVar97);
        auVar95 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar95);
        auVar97 = vmulps_avx512vl(_local_740,auVar104);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_720,auVar103);
        auVar97 = vfmadd231ps_avx512vl(auVar97,local_700,auVar102);
        vandps_avx512vl(auVar97,auVar108);
        uVar12 = vcmpps_avx512vl(auVar97,auVar109,1);
        auVar95 = vxorps_avx512vl(auVar95,auVar94);
        auVar98 = vrcp14ps_avx512vl(auVar97);
        auVar94 = vxorps_avx512vl(auVar97,auVar94);
        auVar102 = vfnmadd213ps_avx512vl(auVar98,auVar97,auVar119);
        auVar71 = vfmadd132ps_fma(auVar102,auVar98,auVar98);
        fVar154 = auVar71._0_4_ * auVar95._0_4_;
        fVar167 = auVar71._4_4_ * auVar95._4_4_;
        auVar38._4_4_ = fVar167;
        auVar38._0_4_ = fVar154;
        fVar169 = auVar71._8_4_ * auVar95._8_4_;
        auVar38._8_4_ = fVar169;
        fVar171 = auVar71._12_4_ * auVar95._12_4_;
        auVar38._12_4_ = fVar171;
        fVar173 = auVar95._16_4_ * 0.0;
        auVar38._16_4_ = fVar173;
        fVar174 = auVar95._20_4_ * 0.0;
        auVar38._20_4_ = fVar174;
        fVar176 = auVar95._24_4_ * 0.0;
        auVar38._24_4_ = fVar176;
        auVar38._28_4_ = auVar95._28_4_;
        uVar14 = vcmpps_avx512vl(auVar97,auVar94,1);
        bVar60 = (byte)uVar12 | (byte)uVar14;
        auVar27._8_4_ = 0xff800000;
        auVar27._0_8_ = 0xff800000ff800000;
        auVar27._12_4_ = 0xff800000;
        auVar27._16_4_ = 0xff800000;
        auVar27._20_4_ = 0xff800000;
        auVar27._24_4_ = 0xff800000;
        auVar27._28_4_ = 0xff800000;
        auVar102 = vblendmps_avx512vl(auVar38,auVar27);
        auVar123._0_4_ =
             (uint)(bVar60 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar60 & 1) * auVar98._0_4_;
        bVar63 = (bool)(bVar60 >> 1 & 1);
        auVar123._4_4_ = (uint)bVar63 * auVar102._4_4_ | (uint)!bVar63 * auVar98._4_4_;
        bVar63 = (bool)(bVar60 >> 2 & 1);
        auVar123._8_4_ = (uint)bVar63 * auVar102._8_4_ | (uint)!bVar63 * auVar98._8_4_;
        bVar63 = (bool)(bVar60 >> 3 & 1);
        auVar123._12_4_ = (uint)bVar63 * auVar102._12_4_ | (uint)!bVar63 * auVar98._12_4_;
        bVar63 = (bool)(bVar60 >> 4 & 1);
        auVar123._16_4_ = (uint)bVar63 * auVar102._16_4_ | (uint)!bVar63 * auVar98._16_4_;
        bVar63 = (bool)(bVar60 >> 5 & 1);
        auVar123._20_4_ = (uint)bVar63 * auVar102._20_4_ | (uint)!bVar63 * auVar98._20_4_;
        bVar63 = (bool)(bVar60 >> 6 & 1);
        auVar123._24_4_ = (uint)bVar63 * auVar102._24_4_ | (uint)!bVar63 * auVar98._24_4_;
        auVar123._28_4_ =
             (uint)(bVar60 >> 7) * auVar102._28_4_ | (uint)!(bool)(bVar60 >> 7) * auVar98._28_4_;
        local_6e0 = vmaxps_avx(auVar115,auVar123);
        uVar14 = vcmpps_avx512vl(auVar97,auVar94,6);
        bVar60 = (byte)uVar12 | (byte)uVar14;
        auVar124._0_4_ = (uint)(bVar60 & 1) * 0x7f800000 | (uint)!(bool)(bVar60 & 1) * (int)fVar154;
        bVar63 = (bool)(bVar60 >> 1 & 1);
        auVar124._4_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar167;
        bVar63 = (bool)(bVar60 >> 2 & 1);
        auVar124._8_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar169;
        bVar63 = (bool)(bVar60 >> 3 & 1);
        auVar124._12_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar171;
        bVar63 = (bool)(bVar60 >> 4 & 1);
        auVar124._16_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar173;
        bVar63 = (bool)(bVar60 >> 5 & 1);
        auVar124._20_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar174;
        bVar63 = (bool)(bVar60 >> 6 & 1);
        auVar124._24_4_ = (uint)bVar63 * 0x7f800000 | (uint)!bVar63 * (int)fVar176;
        auVar124._28_4_ =
             (uint)(bVar60 >> 7) * 0x7f800000 | (uint)!(bool)(bVar60 >> 7) * auVar95._28_4_;
        local_5e0 = vminps_avx(auVar105,auVar124);
        uVar12 = vcmpps_avx512vl(local_6e0,local_5e0,2);
        bVar50 = bVar50 & 0x7f & (byte)uVar12;
        if (bVar50 == 0) {
          auVar254 = ZEXT3264(auVar119);
          goto LAB_019ad252;
        }
        auVar94 = vmaxps_avx512vl(auVar106,auVar93);
        auVar93 = vfmadd213ps_avx512vl(local_940,auVar112,auVar101);
        fVar154 = auVar99._0_4_;
        fVar167 = auVar99._4_4_;
        auVar39._4_4_ = fVar167 * auVar93._4_4_;
        auVar39._0_4_ = fVar154 * auVar93._0_4_;
        fVar169 = auVar99._8_4_;
        auVar39._8_4_ = fVar169 * auVar93._8_4_;
        fVar171 = auVar99._12_4_;
        auVar39._12_4_ = fVar171 * auVar93._12_4_;
        fVar173 = auVar99._16_4_;
        auVar39._16_4_ = fVar173 * auVar93._16_4_;
        fVar174 = auVar99._20_4_;
        auVar39._20_4_ = fVar174 * auVar93._20_4_;
        fVar176 = auVar99._24_4_;
        auVar39._24_4_ = fVar176 * auVar93._24_4_;
        auVar39._28_4_ = auVar93._28_4_;
        auVar93 = vfmadd213ps_avx512vl(local_9a0,auVar112,auVar101);
        auVar40._4_4_ = fVar167 * auVar93._4_4_;
        auVar40._0_4_ = fVar154 * auVar93._0_4_;
        auVar40._8_4_ = fVar169 * auVar93._8_4_;
        auVar40._12_4_ = fVar171 * auVar93._12_4_;
        auVar40._16_4_ = fVar173 * auVar93._16_4_;
        auVar40._20_4_ = fVar174 * auVar93._20_4_;
        auVar40._24_4_ = fVar176 * auVar93._24_4_;
        auVar40._28_4_ = auVar93._28_4_;
        auVar93 = vminps_avx512vl(auVar39,auVar119);
        auVar95 = ZEXT832(0) << 0x20;
        auVar93 = vmaxps_avx(auVar93,ZEXT832(0) << 0x20);
        auVar97 = vminps_avx512vl(auVar40,auVar119);
        auVar41._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar41._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar41._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar41._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar41._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar41._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar41._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar41._28_4_ = auVar93._28_4_ + 7.0;
        local_520 = vfmadd213ps_avx512vl(auVar41,auVar214,auVar197);
        auVar93 = vmaxps_avx(auVar97,ZEXT832(0) << 0x20);
        auVar42._4_4_ = (auVar93._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar93._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar93._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar93._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar93._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar93._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar93._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar93._28_4_ + 7.0;
        local_540 = vfmadd213ps_avx512vl(auVar42,auVar214,auVar197);
        auVar43._4_4_ = auVar94._4_4_ * auVar94._4_4_;
        auVar43._0_4_ = auVar94._0_4_ * auVar94._0_4_;
        auVar43._8_4_ = auVar94._8_4_ * auVar94._8_4_;
        auVar43._12_4_ = auVar94._12_4_ * auVar94._12_4_;
        auVar43._16_4_ = auVar94._16_4_ * auVar94._16_4_;
        auVar43._20_4_ = auVar94._20_4_ * auVar94._20_4_;
        auVar43._24_4_ = auVar94._24_4_ * auVar94._24_4_;
        auVar43._28_4_ = auVar94._28_4_;
        auVar93 = vsubps_avx(auVar111,auVar43);
        auVar44._4_4_ = auVar93._4_4_ * (float)local_7c0._4_4_;
        auVar44._0_4_ = auVar93._0_4_ * (float)local_7c0._0_4_;
        auVar44._8_4_ = auVar93._8_4_ * fStack_7b8;
        auVar44._12_4_ = auVar93._12_4_ * fStack_7b4;
        auVar44._16_4_ = auVar93._16_4_ * fStack_7b0;
        auVar44._20_4_ = auVar93._20_4_ * fStack_7ac;
        auVar44._24_4_ = auVar93._24_4_ * fStack_7a8;
        auVar44._28_4_ = auVar94._28_4_;
        auVar94 = vsubps_avx(local_7a0,auVar44);
        uVar12 = vcmpps_avx512vl(auVar94,ZEXT832(0) << 0x20,5);
        bVar60 = (byte)uVar12;
        if (bVar60 == 0) {
          bVar60 = 0;
          auVar83 = ZEXT832(0) << 0x20;
          auVar235 = ZEXT864(0) << 0x20;
          auVar94 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar97 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar242 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar126._8_4_ = 0xff800000;
          auVar126._0_8_ = 0xff800000ff800000;
          auVar126._12_4_ = 0xff800000;
          auVar126._16_4_ = 0xff800000;
          auVar126._20_4_ = 0xff800000;
          auVar126._24_4_ = 0xff800000;
          auVar126._28_4_ = 0xff800000;
        }
        else {
          auVar72 = vxorps_avx512vl(auVar79,auVar79);
          uVar66 = vcmpps_avx512vl(auVar94,auVar106,5);
          auVar94 = vsqrtps_avx(auVar94);
          auVar95 = vfnmadd213ps_avx512vl(auVar114,local_840,auVar119);
          auVar98 = vfmadd132ps_avx512vl(auVar95,local_840,local_840);
          auVar95 = vsubps_avx(local_7e0,auVar94);
          auVar102 = vmulps_avx512vl(auVar95,auVar98);
          auVar94 = vsubps_avx512vl(auVar94,auVar110);
          auVar98 = vmulps_avx512vl(auVar94,auVar98);
          auVar94 = vfmadd213ps_avx512vl(auVar112,auVar102,auVar101);
          auVar45._4_4_ = fVar167 * auVar94._4_4_;
          auVar45._0_4_ = fVar154 * auVar94._0_4_;
          auVar45._8_4_ = fVar169 * auVar94._8_4_;
          auVar45._12_4_ = fVar171 * auVar94._12_4_;
          auVar45._16_4_ = fVar173 * auVar94._16_4_;
          auVar45._20_4_ = fVar174 * auVar94._20_4_;
          auVar45._24_4_ = fVar176 * auVar94._24_4_;
          auVar45._28_4_ = auVar97._28_4_;
          auVar94 = vmulps_avx512vl(local_700,auVar102);
          auVar95 = vmulps_avx512vl(local_720,auVar102);
          auVar103 = vmulps_avx512vl(_local_740,auVar102);
          auVar97 = vfmadd213ps_avx512vl(auVar83,auVar45,auVar220);
          auVar94 = vsubps_avx512vl(auVar94,auVar97);
          auVar97 = vfmadd213ps_avx512vl(auVar81,auVar45,auVar96);
          auVar97 = vsubps_avx512vl(auVar95,auVar97);
          auVar71 = vfmadd213ps_fma(auVar45,auVar82,auVar100);
          auVar95 = vsubps_avx(auVar103,ZEXT1632(auVar71));
          auVar242 = auVar95._0_28_;
          auVar95 = vfmadd213ps_avx512vl(auVar112,auVar98,auVar101);
          auVar99 = vmulps_avx512vl(auVar99,auVar95);
          auVar251 = ZEXT3264(auVar99);
          auVar95 = vmulps_avx512vl(local_700,auVar98);
          auVar101 = vmulps_avx512vl(local_720,auVar98);
          auVar103 = vmulps_avx512vl(_local_740,auVar98);
          auVar71 = vfmadd213ps_fma(auVar83,auVar99,auVar220);
          auVar95 = vsubps_avx(auVar95,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar81,auVar99,auVar96);
          auVar83 = vsubps_avx512vl(auVar101,ZEXT1632(auVar71));
          auVar71 = vfmadd213ps_fma(auVar82,auVar99,auVar100);
          auVar81 = vsubps_avx512vl(auVar103,ZEXT1632(auVar71));
          auVar235 = ZEXT3264(auVar81);
          auVar198._8_4_ = 0x7f800000;
          auVar198._0_8_ = 0x7f8000007f800000;
          auVar198._12_4_ = 0x7f800000;
          auVar198._16_4_ = 0x7f800000;
          auVar198._20_4_ = 0x7f800000;
          auVar198._24_4_ = 0x7f800000;
          auVar198._28_4_ = 0x7f800000;
          auVar81 = vblendmps_avx512vl(auVar198,auVar102);
          bVar63 = (bool)((byte)uVar66 & 1);
          auVar125._0_4_ = (uint)bVar63 * auVar81._0_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar125._4_4_ = (uint)bVar63 * auVar81._4_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar125._8_4_ = (uint)bVar63 * auVar81._8_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar125._12_4_ = (uint)bVar63 * auVar81._12_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar125._16_4_ = (uint)bVar63 * auVar81._16_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar125._20_4_ = (uint)bVar63 * auVar81._20_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar125._24_4_ = (uint)bVar63 * auVar81._24_4_ | (uint)!bVar63 * 0x7f800000;
          bVar63 = SUB81(uVar66 >> 7,0);
          auVar125._28_4_ = (uint)bVar63 * auVar81._28_4_ | (uint)!bVar63 * 0x7f800000;
          auVar221._8_4_ = 0xff800000;
          auVar221._0_8_ = 0xff800000ff800000;
          auVar221._12_4_ = 0xff800000;
          auVar221._16_4_ = 0xff800000;
          auVar221._20_4_ = 0xff800000;
          auVar221._24_4_ = 0xff800000;
          auVar221._28_4_ = 0xff800000;
          auVar81 = vblendmps_avx512vl(auVar221,auVar98);
          bVar63 = (bool)((byte)uVar66 & 1);
          auVar126._0_4_ = (uint)bVar63 * auVar81._0_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
          auVar126._4_4_ = (uint)bVar63 * auVar81._4_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
          auVar126._8_4_ = (uint)bVar63 * auVar81._8_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
          auVar126._12_4_ = (uint)bVar63 * auVar81._12_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
          auVar126._16_4_ = (uint)bVar63 * auVar81._16_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
          auVar126._20_4_ = (uint)bVar63 * auVar81._20_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
          auVar126._24_4_ = (uint)bVar63 * auVar81._24_4_ | (uint)!bVar63 * -0x800000;
          bVar63 = SUB81(uVar66 >> 7,0);
          auVar126._28_4_ = (uint)bVar63 * auVar81._28_4_ | (uint)!bVar63 * -0x800000;
          auVar28._8_4_ = 0x36000000;
          auVar28._0_8_ = 0x3600000036000000;
          auVar28._12_4_ = 0x36000000;
          auVar28._16_4_ = 0x36000000;
          auVar28._20_4_ = 0x36000000;
          auVar28._24_4_ = 0x36000000;
          auVar28._28_4_ = 0x36000000;
          auVar81 = vmulps_avx512vl(local_800,auVar28);
          uVar56 = vcmpps_avx512vl(auVar81,local_820,0xe);
          uVar66 = uVar66 & uVar56;
          bVar55 = (byte)uVar66;
          if (bVar55 != 0) {
            uVar56 = vcmpps_avx512vl(auVar93,ZEXT1632(auVar72),2);
            auVar240._8_4_ = 0x7f800000;
            auVar240._0_8_ = 0x7f8000007f800000;
            auVar240._12_4_ = 0x7f800000;
            auVar240._16_4_ = 0x7f800000;
            auVar240._20_4_ = 0x7f800000;
            auVar240._24_4_ = 0x7f800000;
            auVar240._28_4_ = 0x7f800000;
            auVar246._8_4_ = 0xff800000;
            auVar246._0_8_ = 0xff800000ff800000;
            auVar246._12_4_ = 0xff800000;
            auVar246._16_4_ = 0xff800000;
            auVar246._20_4_ = 0xff800000;
            auVar246._24_4_ = 0xff800000;
            auVar246._28_4_ = 0xff800000;
            auVar93 = vblendmps_avx512vl(auVar240,auVar246);
            bVar51 = (byte)uVar56;
            uVar67 = (uint)(bVar51 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar51 & 1) * auVar81._0_4_;
            bVar63 = (bool)((byte)(uVar56 >> 1) & 1);
            uVar130 = (uint)bVar63 * auVar93._4_4_ | (uint)!bVar63 * auVar81._4_4_;
            bVar63 = (bool)((byte)(uVar56 >> 2) & 1);
            uVar131 = (uint)bVar63 * auVar93._8_4_ | (uint)!bVar63 * auVar81._8_4_;
            bVar63 = (bool)((byte)(uVar56 >> 3) & 1);
            uVar132 = (uint)bVar63 * auVar93._12_4_ | (uint)!bVar63 * auVar81._12_4_;
            bVar63 = (bool)((byte)(uVar56 >> 4) & 1);
            uVar133 = (uint)bVar63 * auVar93._16_4_ | (uint)!bVar63 * auVar81._16_4_;
            bVar63 = (bool)((byte)(uVar56 >> 5) & 1);
            uVar134 = (uint)bVar63 * auVar93._20_4_ | (uint)!bVar63 * auVar81._20_4_;
            bVar63 = (bool)((byte)(uVar56 >> 6) & 1);
            uVar135 = (uint)bVar63 * auVar93._24_4_ | (uint)!bVar63 * auVar81._24_4_;
            bVar63 = SUB81(uVar56 >> 7,0);
            uVar136 = (uint)bVar63 * auVar93._28_4_ | (uint)!bVar63 * auVar81._28_4_;
            auVar125._0_4_ = (bVar55 & 1) * uVar67 | !(bool)(bVar55 & 1) * auVar125._0_4_;
            bVar63 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar125._4_4_ = bVar63 * uVar130 | !bVar63 * auVar125._4_4_;
            bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar125._8_4_ = bVar63 * uVar131 | !bVar63 * auVar125._8_4_;
            bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar125._12_4_ = bVar63 * uVar132 | !bVar63 * auVar125._12_4_;
            bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar125._16_4_ = bVar63 * uVar133 | !bVar63 * auVar125._16_4_;
            bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar125._20_4_ = bVar63 * uVar134 | !bVar63 * auVar125._20_4_;
            bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar125._24_4_ = bVar63 * uVar135 | !bVar63 * auVar125._24_4_;
            bVar63 = SUB81(uVar66 >> 7,0);
            auVar125._28_4_ = bVar63 * uVar136 | !bVar63 * auVar125._28_4_;
            auVar93 = vblendmps_avx512vl(auVar246,auVar240);
            bVar63 = (bool)((byte)(uVar56 >> 1) & 1);
            bVar5 = (bool)((byte)(uVar56 >> 2) & 1);
            bVar6 = (bool)((byte)(uVar56 >> 3) & 1);
            bVar7 = (bool)((byte)(uVar56 >> 4) & 1);
            bVar8 = (bool)((byte)(uVar56 >> 5) & 1);
            bVar9 = (bool)((byte)(uVar56 >> 6) & 1);
            bVar10 = SUB81(uVar56 >> 7,0);
            auVar126._0_4_ =
                 (uint)(bVar55 & 1) *
                 ((uint)(bVar51 & 1) * auVar93._0_4_ | !(bool)(bVar51 & 1) * uVar67) |
                 !(bool)(bVar55 & 1) * auVar126._0_4_;
            bVar4 = (bool)((byte)(uVar66 >> 1) & 1);
            auVar126._4_4_ =
                 (uint)bVar4 * ((uint)bVar63 * auVar93._4_4_ | !bVar63 * uVar130) |
                 !bVar4 * auVar126._4_4_;
            bVar63 = (bool)((byte)(uVar66 >> 2) & 1);
            auVar126._8_4_ =
                 (uint)bVar63 * ((uint)bVar5 * auVar93._8_4_ | !bVar5 * uVar131) |
                 !bVar63 * auVar126._8_4_;
            bVar63 = (bool)((byte)(uVar66 >> 3) & 1);
            auVar126._12_4_ =
                 (uint)bVar63 * ((uint)bVar6 * auVar93._12_4_ | !bVar6 * uVar132) |
                 !bVar63 * auVar126._12_4_;
            bVar63 = (bool)((byte)(uVar66 >> 4) & 1);
            auVar126._16_4_ =
                 (uint)bVar63 * ((uint)bVar7 * auVar93._16_4_ | !bVar7 * uVar133) |
                 !bVar63 * auVar126._16_4_;
            bVar63 = (bool)((byte)(uVar66 >> 5) & 1);
            auVar126._20_4_ =
                 (uint)bVar63 * ((uint)bVar8 * auVar93._20_4_ | !bVar8 * uVar134) |
                 !bVar63 * auVar126._20_4_;
            bVar63 = (bool)((byte)(uVar66 >> 6) & 1);
            auVar126._24_4_ =
                 (uint)bVar63 * ((uint)bVar9 * auVar93._24_4_ | !bVar9 * uVar135) |
                 !bVar63 * auVar126._24_4_;
            bVar63 = SUB81(uVar66 >> 7,0);
            auVar126._28_4_ =
                 (uint)bVar63 * ((uint)bVar10 * auVar93._28_4_ | !bVar10 * uVar136) |
                 !bVar63 * auVar126._28_4_;
            bVar60 = (~bVar55 | bVar51) & bVar60;
          }
        }
        auVar239._0_4_ = (float)local_740._0_4_ * auVar235._0_4_;
        auVar239._4_4_ = (float)local_740._4_4_ * auVar235._4_4_;
        auVar239._8_4_ = fStack_738 * auVar235._8_4_;
        auVar239._12_4_ = fStack_734 * auVar235._12_4_;
        auVar239._16_4_ = fStack_730 * auVar235._16_4_;
        auVar239._20_4_ = fStack_72c * auVar235._20_4_;
        auVar239._28_36_ = auVar235._28_36_;
        auVar239._24_4_ = fStack_728 * auVar235._24_4_;
        auVar71 = vfmadd231ps_fma(auVar239._0_32_,local_720,auVar83);
        auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),local_700,auVar95);
        auVar238._8_4_ = 0x7fffffff;
        auVar238._0_8_ = 0x7fffffff7fffffff;
        auVar238._12_4_ = 0x7fffffff;
        auVar238._16_4_ = 0x7fffffff;
        auVar238._20_4_ = 0x7fffffff;
        auVar238._24_4_ = 0x7fffffff;
        auVar238._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(ZEXT1632(auVar71),auVar238);
        _local_440 = local_6e0;
        auVar234._8_4_ = 0x3e99999a;
        auVar234._0_8_ = 0x3e99999a3e99999a;
        auVar234._12_4_ = 0x3e99999a;
        auVar234._16_4_ = 0x3e99999a;
        auVar234._20_4_ = 0x3e99999a;
        auVar234._24_4_ = 0x3e99999a;
        auVar234._28_4_ = 0x3e99999a;
        uVar12 = vcmpps_avx512vl(auVar93,auVar234,1);
        _local_680 = vmaxps_avx(local_6e0,auVar126);
        auVar93 = vminps_avx(local_5e0,auVar125);
        uVar14 = vcmpps_avx512vl(local_6e0,auVar93,2);
        bVar55 = (byte)uVar14 & bVar50;
        uVar13 = vcmpps_avx512vl(_local_680,local_5e0,2);
        if ((bVar50 & ((byte)uVar13 | (byte)uVar14)) == 0) {
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar254 = ZEXT3264(auVar93);
          auVar152 = ZEXT3264(_DAT_01f7b040);
          auVar252 = ZEXT3264(local_9c0);
          auVar247 = ZEXT3264(local_9e0);
          auVar249 = ZEXT3264(local_a00);
          auVar243 = ZEXT3264(local_a20);
          auVar235 = ZEXT3264(local_a40);
          auVar239 = ZEXT3264(local_a60);
          auVar241 = ZEXT3264(local_a80);
        }
        else {
          bVar51 = (byte)uVar12 | ~bVar60;
          auVar46._4_4_ = (float)local_740._4_4_ * auVar242._4_4_;
          auVar46._0_4_ = (float)local_740._0_4_ * auVar242._0_4_;
          auVar46._8_4_ = fStack_738 * auVar242._8_4_;
          auVar46._12_4_ = fStack_734 * auVar242._12_4_;
          auVar46._16_4_ = fStack_730 * auVar242._16_4_;
          auVar46._20_4_ = fStack_72c * auVar242._20_4_;
          auVar46._24_4_ = fStack_728 * auVar242._24_4_;
          auVar46._28_4_ = auVar93._28_4_;
          auVar71 = vfmadd213ps_fma(auVar97,local_720,auVar46);
          auVar71 = vfmadd213ps_fma(auVar94,local_700,ZEXT1632(auVar71));
          auVar93 = vandps_avx(ZEXT1632(auVar71),auVar238);
          uVar12 = vcmpps_avx512vl(auVar93,auVar234,1);
          bVar60 = (byte)uVar12 | ~bVar60;
          auVar146._8_4_ = 2;
          auVar146._0_8_ = 0x200000002;
          auVar146._12_4_ = 2;
          auVar146._16_4_ = 2;
          auVar146._20_4_ = 2;
          auVar146._24_4_ = 2;
          auVar146._28_4_ = 2;
          auVar29._8_4_ = 3;
          auVar29._0_8_ = 0x300000003;
          auVar29._12_4_ = 3;
          auVar29._16_4_ = 3;
          auVar29._20_4_ = 3;
          auVar29._24_4_ = 3;
          auVar29._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar146,auVar29);
          local_5c0._0_4_ = (uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * 2;
          bVar63 = (bool)(bVar60 >> 1 & 1);
          local_5c0._4_4_ = (uint)bVar63 * auVar93._4_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar60 >> 2 & 1);
          local_5c0._8_4_ = (uint)bVar63 * auVar93._8_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar60 >> 3 & 1);
          local_5c0._12_4_ = (uint)bVar63 * auVar93._12_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar60 >> 4 & 1);
          local_5c0._16_4_ = (uint)bVar63 * auVar93._16_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar60 >> 5 & 1);
          local_5c0._20_4_ = (uint)bVar63 * auVar93._20_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar60 >> 6 & 1);
          local_5c0._24_4_ = (uint)bVar63 * auVar93._24_4_ | (uint)!bVar63 * 2;
          local_5c0._28_4_ = (uint)(bVar60 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar60 >> 7) * 2;
          local_620 = vpbroadcastd_avx512vl();
          uVar12 = vpcmpd_avx512vl(local_620,local_5c0,5);
          local_660 = local_6e0._0_4_ + (float)local_960._0_4_;
          fStack_65c = local_6e0._4_4_ + (float)local_960._4_4_;
          fStack_658 = local_6e0._8_4_ + fStack_958;
          fStack_654 = local_6e0._12_4_ + fStack_954;
          fStack_650 = local_6e0._16_4_ + fStack_950;
          fStack_64c = local_6e0._20_4_ + fStack_94c;
          fStack_648 = local_6e0._24_4_ + fStack_948;
          fStack_644 = local_6e0._28_4_ + fStack_944;
          _local_600 = _local_680;
          for (bVar60 = (byte)uVar12 & bVar55; bVar60 != 0; bVar60 = ~bVar57 & bVar60 & (byte)uVar12
              ) {
            auVar147._8_4_ = 0x7f800000;
            auVar147._0_8_ = 0x7f8000007f800000;
            auVar147._12_4_ = 0x7f800000;
            auVar147._16_4_ = 0x7f800000;
            auVar147._20_4_ = 0x7f800000;
            auVar147._24_4_ = 0x7f800000;
            auVar147._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar147,local_6e0);
            auVar127._0_4_ =
                 (uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 1 & 1);
            auVar127._4_4_ = (uint)bVar63 * auVar93._4_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 2 & 1);
            auVar127._8_4_ = (uint)bVar63 * auVar93._8_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 3 & 1);
            auVar127._12_4_ = (uint)bVar63 * auVar93._12_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 4 & 1);
            auVar127._16_4_ = (uint)bVar63 * auVar93._16_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 5 & 1);
            auVar127._20_4_ = (uint)bVar63 * auVar93._20_4_ | (uint)!bVar63 * 0x7f800000;
            auVar127._24_4_ =
                 (uint)(bVar60 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
            auVar127._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar127,auVar127,0xb1);
            auVar93 = vminps_avx(auVar127,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar12 = vcmpps_avx512vl(auVar127,auVar93,0);
            bVar52 = (byte)uVar12 & bVar60;
            bVar57 = bVar60;
            if (bVar52 != 0) {
              bVar57 = bVar52;
            }
            iVar15 = 0;
            for (uVar67 = (uint)bVar57; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar57 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar67 = *(uint *)(local_520 + (uint)(iVar15 << 2));
            uVar130 = *(uint *)(local_440 + (uint)(iVar15 << 2));
            fVar153 = auVar11._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              auVar251 = ZEXT1664(auVar251._0_16_);
              fVar153 = sqrtf((float)local_980._0_4_);
            }
            uVar66 = (ulong)bVar57;
            auVar72 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar71 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar68 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar76 = vminps_avx(auVar72,auVar68);
            auVar72 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar68 = vmaxps_avx(auVar71,auVar72);
            auVar202._8_4_ = 0x7fffffff;
            auVar202._0_8_ = 0x7fffffff7fffffff;
            auVar202._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar76,auVar202);
            auVar72 = vandps_avx(auVar68,auVar202);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar166 = auVar71._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar68,auVar68,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar130),ZEXT416(uVar67),0x10);
            auVar152 = ZEXT1664(auVar71);
            uVar56 = 0;
            while( true ) {
              bVar52 = (byte)uVar66;
              if (uVar56 == 5) break;
              uVar155 = auVar152._0_4_;
              auVar139._4_4_ = uVar155;
              auVar139._0_4_ = uVar155;
              auVar139._8_4_ = uVar155;
              auVar139._12_4_ = uVar155;
              auVar72 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_970);
              auVar68 = auVar152._0_16_;
              auVar71 = vmovshdup_avx(auVar68);
              local_7e0._0_16_ = auVar71;
              fVar201 = 1.0 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar68,auVar68,0x55);
              fVar168 = auVar71._0_4_;
              auVar177._0_4_ = local_8a0._0_4_ * fVar168;
              fVar170 = auVar71._4_4_;
              auVar177._4_4_ = local_8a0._4_4_ * fVar170;
              fVar138 = auVar71._8_4_;
              auVar177._8_4_ = local_8a0._8_4_ * fVar138;
              fVar172 = auVar71._12_4_;
              auVar177._12_4_ = local_8a0._12_4_ * fVar172;
              _local_7c0 = ZEXT416((uint)fVar201);
              auVar203._4_4_ = fVar201;
              auVar203._0_4_ = fVar201;
              auVar203._8_4_ = fVar201;
              auVar203._12_4_ = fVar201;
              auVar71 = vfmadd231ps_fma(auVar177,auVar203,local_860._0_16_);
              auVar216._0_4_ = local_880._0_4_ * fVar168;
              auVar216._4_4_ = local_880._4_4_ * fVar170;
              auVar216._8_4_ = local_880._8_4_ * fVar138;
              auVar216._12_4_ = local_880._12_4_ * fVar172;
              auVar68 = vfmadd231ps_fma(auVar216,auVar203,local_8a0._0_16_);
              auVar223._0_4_ = fVar168 * (float)local_8c0._0_4_;
              auVar223._4_4_ = fVar170 * (float)local_8c0._4_4_;
              auVar223._8_4_ = fVar138 * fStack_8b8;
              auVar223._12_4_ = fVar172 * fStack_8b4;
              auVar76 = vfmadd231ps_fma(auVar223,auVar203,local_880._0_16_);
              auVar231._0_4_ = fVar168 * auVar68._0_4_;
              auVar231._4_4_ = fVar170 * auVar68._4_4_;
              auVar231._8_4_ = fVar138 * auVar68._8_4_;
              auVar231._12_4_ = fVar172 * auVar68._12_4_;
              auVar71 = vfmadd231ps_fma(auVar231,auVar203,auVar71);
              auVar178._0_4_ = fVar168 * auVar76._0_4_;
              auVar178._4_4_ = fVar170 * auVar76._4_4_;
              auVar178._8_4_ = fVar138 * auVar76._8_4_;
              auVar178._12_4_ = fVar172 * auVar76._12_4_;
              auVar68 = vfmadd231ps_fma(auVar178,auVar203,auVar68);
              auVar217._0_4_ = fVar168 * auVar68._0_4_;
              auVar217._4_4_ = fVar170 * auVar68._4_4_;
              auVar217._8_4_ = fVar138 * auVar68._8_4_;
              auVar217._12_4_ = fVar172 * auVar68._12_4_;
              auVar76 = vfmadd231ps_fma(auVar217,auVar71,auVar203);
              auVar71 = vsubps_avx(auVar68,auVar71);
              auVar16._8_4_ = 0x40400000;
              auVar16._0_8_ = 0x4040000040400000;
              auVar16._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar71,auVar16);
              local_7a0._0_16_ = auVar76;
              auVar72 = vsubps_avx(auVar72,auVar76);
              auVar71 = vdpps_avx(auVar72,auVar72,0x7f);
              fVar168 = auVar71._0_4_;
              local_780 = auVar152;
              if (fVar168 < 0.0) {
                auVar243._0_4_ = sqrtf(fVar168);
                auVar243._4_60_ = extraout_var;
                auVar76 = auVar243._0_16_;
                uVar66 = extraout_RAX;
              }
              else {
                auVar76 = vsqrtss_avx(auVar71,auVar71);
              }
              local_800._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar170 = local_800._0_4_;
              auVar179._4_12_ = ZEXT812(0) << 0x20;
              auVar179._0_4_ = fVar170;
              local_9a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              fVar138 = local_9a0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar179);
              auVar17._8_4_ = 0x80000000;
              auVar17._0_8_ = 0x8000000080000000;
              auVar17._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_800._0_16_,auVar17);
              auVar73 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar73._0_4_;
              local_940._0_4_ = auVar76._0_4_;
              if (fVar170 < auVar69._0_4_) {
                fVar172 = sqrtf(fVar170);
                auVar76 = ZEXT416((uint)local_940._0_4_);
                uVar66 = extraout_RAX_00;
              }
              else {
                auVar73 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar172 = auVar73._0_4_;
              }
              fVar201 = local_9a0._0_4_;
              fVar170 = fVar138 * 1.5 + fVar170 * -0.5 * fVar201 * fVar201 * fVar201;
              auVar140._0_4_ = auVar68._0_4_ * fVar170;
              auVar140._4_4_ = auVar68._4_4_ * fVar170;
              auVar140._8_4_ = auVar68._8_4_ * fVar170;
              auVar140._12_4_ = auVar68._12_4_ * fVar170;
              local_9a0._0_16_ = vdpps_avx(auVar72,auVar140,0x7f);
              fVar201 = auVar76._0_4_;
              auVar141._0_4_ = local_9a0._0_4_ * local_9a0._0_4_;
              auVar141._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
              auVar141._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
              auVar141._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
              auVar71 = vsubps_avx(auVar71,auVar141);
              fVar138 = auVar71._0_4_;
              auVar156._4_12_ = ZEXT812(0) << 0x20;
              auVar156._0_4_ = fVar138;
              auVar73 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar156);
              auVar69 = vmulss_avx512f(auVar73,ZEXT416(0x3fc00000));
              auVar74 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              if (fVar138 < 0.0) {
                local_8d0._0_4_ = fVar172;
                local_8f0._0_4_ = auVar69._0_4_;
                local_900._4_4_ = fVar170;
                local_900._0_4_ = fVar170;
                fStack_8f8 = fVar170;
                fStack_8f4 = fVar170;
                local_8e0 = auVar73;
                fVar138 = sqrtf(fVar138);
                auVar74 = ZEXT416(auVar74._0_4_);
                auVar69 = ZEXT416((uint)local_8f0._0_4_);
                auVar76 = ZEXT416((uint)local_940._0_4_);
                uVar66 = extraout_RAX_01;
                auVar73 = local_8e0;
                fVar170 = (float)local_900._0_4_;
                fVar175 = (float)local_900._4_4_;
                fVar154 = fStack_8f8;
                fVar167 = fStack_8f4;
                fVar172 = (float)local_8d0._0_4_;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar138 = auVar71._0_4_;
                fVar175 = fVar170;
                fVar154 = fVar170;
                fVar167 = fVar170;
              }
              auVar77 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_);
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar169 = auVar71._0_4_ * 6.0;
              fVar171 = local_7e0._0_4_ * 6.0;
              auVar204._0_4_ = fVar171 * (float)local_8c0._0_4_;
              auVar204._4_4_ = fVar171 * (float)local_8c0._4_4_;
              auVar204._8_4_ = fVar171 * fStack_8b8;
              auVar204._12_4_ = fVar171 * fStack_8b4;
              auVar180._4_4_ = fVar169;
              auVar180._0_4_ = fVar169;
              auVar180._8_4_ = fVar169;
              auVar180._12_4_ = fVar169;
              auVar71 = vfmadd132ps_fma(auVar180,auVar204,local_880._0_16_);
              fVar169 = auVar77._0_4_ * 6.0;
              auVar157._4_4_ = fVar169;
              auVar157._0_4_ = fVar169;
              auVar157._8_4_ = fVar169;
              auVar157._12_4_ = fVar169;
              auVar71 = vfmadd132ps_fma(auVar157,auVar71,local_8a0._0_16_);
              fVar169 = local_7c0._0_4_ * 6.0;
              auVar181._4_4_ = fVar169;
              auVar181._0_4_ = fVar169;
              auVar181._8_4_ = fVar169;
              auVar181._12_4_ = fVar169;
              auVar71 = vfmadd132ps_fma(auVar181,auVar71,local_860._0_16_);
              auVar158._0_4_ = auVar71._0_4_ * (float)local_800._0_4_;
              auVar158._4_4_ = auVar71._4_4_ * (float)local_800._0_4_;
              auVar158._8_4_ = auVar71._8_4_ * (float)local_800._0_4_;
              auVar158._12_4_ = auVar71._12_4_ * (float)local_800._0_4_;
              auVar71 = vdpps_avx(auVar68,auVar71,0x7f);
              fVar169 = auVar71._0_4_;
              auVar182._0_4_ = auVar68._0_4_ * fVar169;
              auVar182._4_4_ = auVar68._4_4_ * fVar169;
              auVar182._8_4_ = auVar68._8_4_ * fVar169;
              auVar182._12_4_ = auVar68._12_4_ * fVar169;
              auVar71 = vsubps_avx(auVar158,auVar182);
              fVar169 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar77 = vmaxss_avx(ZEXT416((uint)fVar166),
                                   ZEXT416((uint)(local_780._0_4_ * fVar153 * 1.9073486e-06)));
              auVar18._8_4_ = 0x80000000;
              auVar18._0_8_ = 0x8000000080000000;
              auVar18._12_4_ = 0x80000000;
              auVar75 = vxorps_avx512vl(auVar68,auVar18);
              auVar183._0_4_ = fVar170 * auVar71._0_4_ * fVar169;
              auVar183._4_4_ = fVar175 * auVar71._4_4_ * fVar169;
              auVar183._8_4_ = fVar154 * auVar71._8_4_ * fVar169;
              auVar183._12_4_ = fVar167 * auVar71._12_4_ * fVar169;
              auVar251 = ZEXT1664(auVar140);
              auVar71 = vdpps_avx(auVar75,auVar140,0x7f);
              auVar78 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar166),auVar77);
              auVar76 = vdpps_avx(auVar72,auVar183,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(fVar201 + 1.0)),
                                        ZEXT416((uint)(fVar166 / fVar172)),auVar78);
              fVar170 = auVar71._0_4_ + auVar76._0_4_;
              auVar71 = vdpps_avx(local_970,auVar140,0x7f);
              auVar76 = vdpps_avx(auVar72,auVar75,0x7f);
              auVar74 = vmulss_avx512f(auVar74,auVar73);
              auVar73 = vmulss_avx512f(auVar73,auVar73);
              auVar74 = vaddss_avx512f(auVar69,ZEXT416((uint)(auVar74._0_4_ * auVar73._0_4_)));
              auVar73 = vdpps_avx(auVar72,local_970,0x7f);
              auVar75 = vfnmadd231ss_avx512f(auVar76,local_9a0._0_16_,ZEXT416((uint)fVar170));
              auVar73 = vfnmadd231ss_avx512f(auVar73,local_9a0._0_16_,auVar71);
              auVar76 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar138 = fVar138 - auVar76._0_4_;
              auVar69 = vshufps_avx(auVar68,auVar68,0xff);
              auVar76 = vfmsub213ss_fma(auVar75,auVar74,auVar69);
              auVar236._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar73 = ZEXT416((uint)(auVar73._0_4_ * auVar74._0_4_));
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar170),auVar73);
              auVar76 = vinsertps_avx(auVar236,auVar73,0x1c);
              auVar224._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar224._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar224._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar73 = vinsertps_avx(ZEXT416((uint)fVar170),auVar224,0x10);
              auVar205._0_4_ = auVar74._0_4_;
              auVar205._4_4_ = auVar205._0_4_;
              auVar205._8_4_ = auVar205._0_4_;
              auVar205._12_4_ = auVar205._0_4_;
              auVar71 = vdivps_avx(auVar76,auVar205);
              auVar76 = vdivps_avx(auVar73,auVar205);
              auVar73 = vbroadcastss_avx512vl(local_9a0._0_16_);
              auVar206._0_4_ = auVar73._0_4_ * auVar71._0_4_ + fVar138 * auVar76._0_4_;
              auVar206._4_4_ = auVar73._4_4_ * auVar71._4_4_ + fVar138 * auVar76._4_4_;
              auVar206._8_4_ = auVar73._8_4_ * auVar71._8_4_ + fVar138 * auVar76._8_4_;
              auVar206._12_4_ = auVar73._12_4_ * auVar71._12_4_ + fVar138 * auVar76._12_4_;
              auVar71 = vsubps_avx(local_780._0_16_,auVar206);
              auVar152 = ZEXT1664(auVar71);
              auVar19._8_4_ = 0x7fffffff;
              auVar19._0_8_ = 0x7fffffff7fffffff;
              auVar19._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_9a0._0_16_,auVar19);
              if (auVar76._0_4_ < auVar78._0_4_) {
                auVar76 = vfmadd231ss_fma(ZEXT416((uint)(auVar78._0_4_ + auVar77._0_4_)),local_910,
                                          ZEXT416(0x36000000));
                auVar20._8_4_ = 0x7fffffff;
                auVar20._0_8_ = 0x7fffffff7fffffff;
                auVar20._12_4_ = 0x7fffffff;
                auVar73 = vandps_avx512vl(ZEXT416((uint)fVar138),auVar20);
                if (auVar73._0_4_ < auVar76._0_4_) {
                  bVar63 = uVar56 < 5;
                  fVar153 = auVar71._0_4_ + (float)local_920._0_4_;
                  if ((fVar250 <= fVar153) &&
                     (fVar166 = *(float *)(ray + k * 4 + 0x200), fVar153 <= fVar166)) {
                    auVar71 = vmovshdup_avx(auVar71);
                    bVar52 = 0;
                    if ((auVar71._0_4_ < 0.0) || (1.0 < auVar71._0_4_)) goto LAB_019adbb4;
                    auVar207._0_12_ = ZEXT812(0);
                    auVar207._12_4_ = 0;
                    auVar184._4_8_ = auVar207._4_8_;
                    auVar184._0_4_ = fVar168;
                    auVar184._12_4_ = 0;
                    auVar71 = vrsqrt14ss_avx512f(auVar207,auVar184);
                    fVar170 = auVar71._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar52 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019adbb4;
                      fVar168 = fVar170 * 1.5 + fVar168 * -0.5 * fVar170 * fVar170 * fVar170;
                      auVar185._0_4_ = auVar72._0_4_ * fVar168;
                      auVar185._4_4_ = auVar72._4_4_ * fVar168;
                      auVar185._8_4_ = auVar72._8_4_ * fVar168;
                      auVar185._12_4_ = auVar72._12_4_ * fVar168;
                      auVar76 = vfmadd213ps_fma(auVar69,auVar185,auVar68);
                      auVar71 = vshufps_avx(auVar185,auVar185,0xc9);
                      auVar72 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar186._0_4_ = auVar185._0_4_ * auVar72._0_4_;
                      auVar186._4_4_ = auVar185._4_4_ * auVar72._4_4_;
                      auVar186._8_4_ = auVar185._8_4_ * auVar72._8_4_;
                      auVar186._12_4_ = auVar185._12_4_ * auVar72._12_4_;
                      auVar68 = vfmsub231ps_fma(auVar186,auVar68,auVar71);
                      auVar71 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar72 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                      auVar142._0_4_ = auVar76._0_4_ * auVar68._0_4_;
                      auVar142._4_4_ = auVar76._4_4_ * auVar68._4_4_;
                      auVar142._8_4_ = auVar76._8_4_ * auVar68._8_4_;
                      auVar142._12_4_ = auVar76._12_4_ * auVar68._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar142,auVar71,auVar72);
                      auVar235 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar235,auVar152);
                      auVar152 = vpermps_avx512f(auVar235,ZEXT1664(auVar71));
                      auVar235 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar235,ZEXT1664(auVar71));
                      local_380 = vbroadcastss_avx512f(auVar71);
                      local_400[0] = (RTCHitN)auVar152[0];
                      local_400[1] = (RTCHitN)auVar152[1];
                      local_400[2] = (RTCHitN)auVar152[2];
                      local_400[3] = (RTCHitN)auVar152[3];
                      local_400[4] = (RTCHitN)auVar152[4];
                      local_400[5] = (RTCHitN)auVar152[5];
                      local_400[6] = (RTCHitN)auVar152[6];
                      local_400[7] = (RTCHitN)auVar152[7];
                      local_400[8] = (RTCHitN)auVar152[8];
                      local_400[9] = (RTCHitN)auVar152[9];
                      local_400[10] = (RTCHitN)auVar152[10];
                      local_400[0xb] = (RTCHitN)auVar152[0xb];
                      local_400[0xc] = (RTCHitN)auVar152[0xc];
                      local_400[0xd] = (RTCHitN)auVar152[0xd];
                      local_400[0xe] = (RTCHitN)auVar152[0xe];
                      local_400[0xf] = (RTCHitN)auVar152[0xf];
                      local_400[0x10] = (RTCHitN)auVar152[0x10];
                      local_400[0x11] = (RTCHitN)auVar152[0x11];
                      local_400[0x12] = (RTCHitN)auVar152[0x12];
                      local_400[0x13] = (RTCHitN)auVar152[0x13];
                      local_400[0x14] = (RTCHitN)auVar152[0x14];
                      local_400[0x15] = (RTCHitN)auVar152[0x15];
                      local_400[0x16] = (RTCHitN)auVar152[0x16];
                      local_400[0x17] = (RTCHitN)auVar152[0x17];
                      local_400[0x18] = (RTCHitN)auVar152[0x18];
                      local_400[0x19] = (RTCHitN)auVar152[0x19];
                      local_400[0x1a] = (RTCHitN)auVar152[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar152[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar152[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar152[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar152[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar152[0x1f];
                      local_400[0x20] = (RTCHitN)auVar152[0x20];
                      local_400[0x21] = (RTCHitN)auVar152[0x21];
                      local_400[0x22] = (RTCHitN)auVar152[0x22];
                      local_400[0x23] = (RTCHitN)auVar152[0x23];
                      local_400[0x24] = (RTCHitN)auVar152[0x24];
                      local_400[0x25] = (RTCHitN)auVar152[0x25];
                      local_400[0x26] = (RTCHitN)auVar152[0x26];
                      local_400[0x27] = (RTCHitN)auVar152[0x27];
                      local_400[0x28] = (RTCHitN)auVar152[0x28];
                      local_400[0x29] = (RTCHitN)auVar152[0x29];
                      local_400[0x2a] = (RTCHitN)auVar152[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar152[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar152[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar152[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar152[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar152[0x2f];
                      local_400[0x30] = (RTCHitN)auVar152[0x30];
                      local_400[0x31] = (RTCHitN)auVar152[0x31];
                      local_400[0x32] = (RTCHitN)auVar152[0x32];
                      local_400[0x33] = (RTCHitN)auVar152[0x33];
                      local_400[0x34] = (RTCHitN)auVar152[0x34];
                      local_400[0x35] = (RTCHitN)auVar152[0x35];
                      local_400[0x36] = (RTCHitN)auVar152[0x36];
                      local_400[0x37] = (RTCHitN)auVar152[0x37];
                      local_400[0x38] = (RTCHitN)auVar152[0x38];
                      local_400[0x39] = (RTCHitN)auVar152[0x39];
                      local_400[0x3a] = (RTCHitN)auVar152[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar152[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar152[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar152[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar152[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar152[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar152 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar152);
                      vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar153;
                      auVar152 = vmovdqa64_avx512f(local_500);
                      local_6c0 = vmovdqa64_avx512f(auVar152);
                      local_ab0.valid = (int *)local_6c0;
                      local_ab0.geometryUserPtr = pGVar2->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_400;
                      local_ab0.N = 0x10;
                      local_ab0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar251 = ZEXT1664(auVar140);
                        (*pGVar2->occlusionFilterN)(&local_ab0);
                        auVar152 = vmovdqa64_avx512f(local_6c0);
                      }
                      uVar12 = vptestmd_avx512f(auVar152,auVar152);
                      if ((short)uVar12 != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar251 = ZEXT1664(auVar251._0_16_);
                          (*p_Var3)(&local_ab0);
                          auVar152 = vmovdqa64_avx512f(local_6c0);
                        }
                        uVar66 = vptestmd_avx512f(auVar152,auVar152);
                        auVar152 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar66 & 1);
                        auVar247._0_4_ =
                             (uint)bVar4 * auVar152._0_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x200);
                        bVar4 = (bool)((byte)(uVar66 >> 1) & 1);
                        auVar247._4_4_ =
                             (uint)bVar4 * auVar152._4_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x204);
                        bVar4 = (bool)((byte)(uVar66 >> 2) & 1);
                        auVar247._8_4_ =
                             (uint)bVar4 * auVar152._8_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x208);
                        bVar4 = (bool)((byte)(uVar66 >> 3) & 1);
                        auVar247._12_4_ =
                             (uint)bVar4 * auVar152._12_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x20c);
                        bVar4 = (bool)((byte)(uVar66 >> 4) & 1);
                        auVar247._16_4_ =
                             (uint)bVar4 * auVar152._16_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x210);
                        bVar4 = (bool)((byte)(uVar66 >> 5) & 1);
                        auVar247._20_4_ =
                             (uint)bVar4 * auVar152._20_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x214);
                        bVar4 = (bool)((byte)(uVar66 >> 6) & 1);
                        auVar247._24_4_ =
                             (uint)bVar4 * auVar152._24_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x218);
                        bVar4 = (bool)((byte)(uVar66 >> 7) & 1);
                        auVar247._28_4_ =
                             (uint)bVar4 * auVar152._28_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x21c);
                        bVar4 = (bool)((byte)(uVar66 >> 8) & 1);
                        auVar247._32_4_ =
                             (uint)bVar4 * auVar152._32_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x220);
                        bVar4 = (bool)((byte)(uVar66 >> 9) & 1);
                        auVar247._36_4_ =
                             (uint)bVar4 * auVar152._36_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x224);
                        bVar4 = (bool)((byte)(uVar66 >> 10) & 1);
                        auVar247._40_4_ =
                             (uint)bVar4 * auVar152._40_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x228);
                        bVar4 = (bool)((byte)(uVar66 >> 0xb) & 1);
                        auVar247._44_4_ =
                             (uint)bVar4 * auVar152._44_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x22c);
                        bVar4 = (bool)((byte)(uVar66 >> 0xc) & 1);
                        auVar247._48_4_ =
                             (uint)bVar4 * auVar152._48_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x230);
                        bVar4 = (bool)((byte)(uVar66 >> 0xd) & 1);
                        auVar247._52_4_ =
                             (uint)bVar4 * auVar152._52_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x234);
                        bVar4 = (bool)((byte)(uVar66 >> 0xe) & 1);
                        auVar247._56_4_ =
                             (uint)bVar4 * auVar152._56_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x238);
                        bVar4 = SUB81(uVar66 >> 0xf,0);
                        auVar247._60_4_ =
                             (uint)bVar4 * auVar152._60_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_ab0.ray + 0x200) = auVar247;
                        bVar52 = 1;
                        if ((short)uVar66 != 0) goto LAB_019adbb4;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar166;
                    }
                  }
                  bVar52 = 0;
                  goto LAB_019adbb4;
                }
              }
              uVar56 = uVar56 + 1;
            }
            bVar63 = false;
LAB_019adbb4:
            bVar62 = bVar62 | bVar63 & bVar52;
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar228._4_4_ = uVar155;
            auVar228._0_4_ = uVar155;
            auVar228._8_4_ = uVar155;
            auVar228._12_4_ = uVar155;
            auVar228._16_4_ = uVar155;
            auVar228._20_4_ = uVar155;
            auVar228._24_4_ = uVar155;
            auVar228._28_4_ = uVar155;
            auVar152 = ZEXT3264(auVar228);
            auVar47._4_4_ = fStack_65c;
            auVar47._0_4_ = local_660;
            auVar47._8_4_ = fStack_658;
            auVar47._12_4_ = fStack_654;
            auVar47._16_4_ = fStack_650;
            auVar47._20_4_ = fStack_64c;
            auVar47._24_4_ = fStack_648;
            auVar47._28_4_ = fStack_644;
            uVar12 = vcmpps_avx512vl(auVar228,auVar47,0xd);
          }
          auVar148._0_4_ = (float)local_960._0_4_ + (float)local_680._0_4_;
          auVar148._4_4_ = (float)local_960._4_4_ + (float)local_680._4_4_;
          auVar148._8_4_ = fStack_958 + fStack_678;
          auVar148._12_4_ = fStack_954 + fStack_674;
          auVar148._16_4_ = fStack_950 + fStack_670;
          auVar148._20_4_ = fStack_94c + fStack_66c;
          auVar148._24_4_ = fStack_948 + fStack_668;
          auVar148._28_4_ = fStack_944 + fStack_664;
          uVar155 = auVar152._0_4_;
          auVar162._4_4_ = uVar155;
          auVar162._0_4_ = uVar155;
          auVar162._8_4_ = uVar155;
          auVar162._12_4_ = uVar155;
          auVar162._16_4_ = uVar155;
          auVar162._20_4_ = uVar155;
          auVar162._24_4_ = uVar155;
          auVar162._28_4_ = uVar155;
          uVar12 = vcmpps_avx512vl(auVar148,auVar162,2);
          auVar149._8_4_ = 2;
          auVar149._0_8_ = 0x200000002;
          auVar149._12_4_ = 2;
          auVar149._16_4_ = 2;
          auVar149._20_4_ = 2;
          auVar149._24_4_ = 2;
          auVar149._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar93 = vpblendmd_avx512vl(auVar149,auVar30);
          local_680._0_4_ = (uint)(bVar51 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar51 & 1) * 2;
          bVar63 = (bool)(bVar51 >> 1 & 1);
          local_680._4_4_ = (uint)bVar63 * auVar93._4_4_ | (uint)!bVar63 * 2;
          bVar63 = (bool)(bVar51 >> 2 & 1);
          fStack_678 = (float)((uint)bVar63 * auVar93._8_4_ | (uint)!bVar63 * 2);
          bVar63 = (bool)(bVar51 >> 3 & 1);
          fStack_674 = (float)((uint)bVar63 * auVar93._12_4_ | (uint)!bVar63 * 2);
          bVar63 = (bool)(bVar51 >> 4 & 1);
          fStack_670 = (float)((uint)bVar63 * auVar93._16_4_ | (uint)!bVar63 * 2);
          bVar63 = (bool)(bVar51 >> 5 & 1);
          fStack_66c = (float)((uint)bVar63 * auVar93._20_4_ | (uint)!bVar63 * 2);
          bVar63 = (bool)(bVar51 >> 6 & 1);
          fStack_668 = (float)((uint)bVar63 * auVar93._24_4_ | (uint)!bVar63 * 2);
          fStack_664 = (float)((uint)(bVar51 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar51 >> 7) * 2
                              );
          bVar50 = (byte)uVar13 & bVar50 & (byte)uVar12;
          uVar12 = vpcmpd_avx512vl(_local_680,local_620,2);
          local_6e0 = _local_600;
          local_660 = (float)local_960._0_4_ + (float)local_600._0_4_;
          fStack_65c = (float)local_960._4_4_ + (float)local_600._4_4_;
          fStack_658 = fStack_958 + fStack_5f8;
          fStack_654 = fStack_954 + fStack_5f4;
          fStack_650 = fStack_950 + fStack_5f0;
          fStack_64c = fStack_94c + fStack_5ec;
          fStack_648 = fStack_948 + fStack_5e8;
          fStack_644 = fStack_944 + fStack_5e4;
          auVar252 = ZEXT3264(local_9c0);
          auVar247 = ZEXT3264(local_9e0);
          auVar249 = ZEXT3264(local_a00);
          auVar243 = ZEXT3264(local_a20);
          auVar235 = ZEXT3264(local_a40);
          auVar239 = ZEXT3264(local_a60);
          auVar241 = ZEXT3264(local_a80);
          for (bVar60 = (byte)uVar12 & bVar50; bVar60 != 0; bVar60 = ~bVar51 & bVar60 & (byte)uVar12
              ) {
            auVar150._8_4_ = 0x7f800000;
            auVar150._0_8_ = 0x7f8000007f800000;
            auVar150._12_4_ = 0x7f800000;
            auVar150._16_4_ = 0x7f800000;
            auVar150._20_4_ = 0x7f800000;
            auVar150._24_4_ = 0x7f800000;
            auVar150._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar150,local_6e0);
            auVar128._0_4_ =
                 (uint)(bVar60 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar60 & 1) * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 1 & 1);
            auVar128._4_4_ = (uint)bVar63 * auVar93._4_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 2 & 1);
            auVar128._8_4_ = (uint)bVar63 * auVar93._8_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 3 & 1);
            auVar128._12_4_ = (uint)bVar63 * auVar93._12_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 4 & 1);
            auVar128._16_4_ = (uint)bVar63 * auVar93._16_4_ | (uint)!bVar63 * 0x7f800000;
            bVar63 = (bool)(bVar60 >> 5 & 1);
            auVar128._20_4_ = (uint)bVar63 * auVar93._20_4_ | (uint)!bVar63 * 0x7f800000;
            auVar128._24_4_ =
                 (uint)(bVar60 >> 6) * auVar93._24_4_ | (uint)!(bool)(bVar60 >> 6) * 0x7f800000;
            auVar128._28_4_ = 0x7f800000;
            auVar93 = vshufps_avx(auVar128,auVar128,0xb1);
            auVar93 = vminps_avx(auVar128,auVar93);
            auVar94 = vshufpd_avx(auVar93,auVar93,5);
            auVar93 = vminps_avx(auVar93,auVar94);
            auVar94 = vpermpd_avx2(auVar93,0x4e);
            auVar93 = vminps_avx(auVar93,auVar94);
            uVar12 = vcmpps_avx512vl(auVar128,auVar93,0);
            bVar57 = (byte)uVar12 & bVar60;
            bVar51 = bVar60;
            if (bVar57 != 0) {
              bVar51 = bVar57;
            }
            iVar15 = 0;
            for (uVar67 = (uint)bVar51; (uVar67 & 1) == 0; uVar67 = uVar67 >> 1 | 0x80000000) {
              iVar15 = iVar15 + 1;
            }
            bVar51 = '\x01' << ((byte)iVar15 & 0x1f);
            uVar67 = *(uint *)(local_540 + (uint)(iVar15 << 2));
            uVar130 = *(uint *)(local_5e0 + (uint)(iVar15 << 2));
            fVar153 = auVar70._0_4_;
            if ((float)local_980._0_4_ < 0.0) {
              auVar251 = ZEXT1664(auVar251._0_16_);
              fVar153 = sqrtf((float)local_980._0_4_);
              auVar241 = ZEXT3264(local_a80);
              auVar239 = ZEXT3264(local_a60);
              auVar235 = ZEXT3264(local_a40);
              auVar243 = ZEXT3264(local_a20);
              auVar249 = ZEXT3264(local_a00);
              auVar247 = ZEXT3264(local_9e0);
              auVar252 = ZEXT3264(local_9c0);
            }
            uVar66 = (ulong)bVar51;
            auVar72 = vminps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar71 = vmaxps_avx(local_860._0_16_,local_8a0._0_16_);
            auVar68 = vminps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar76 = vminps_avx(auVar72,auVar68);
            auVar72 = vmaxps_avx(local_880._0_16_,local_8c0._0_16_);
            auVar68 = vmaxps_avx(auVar71,auVar72);
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar71 = vandps_avx(auVar76,auVar208);
            auVar72 = vandps_avx(auVar68,auVar208);
            auVar71 = vmaxps_avx(auVar71,auVar72);
            auVar72 = vmovshdup_avx(auVar71);
            auVar72 = vmaxss_avx(auVar72,auVar71);
            auVar71 = vshufpd_avx(auVar71,auVar71,1);
            auVar71 = vmaxss_avx(auVar71,auVar72);
            fVar166 = auVar71._0_4_ * 1.9073486e-06;
            local_910 = vshufps_avx(auVar68,auVar68,0xff);
            auVar71 = vinsertps_avx(ZEXT416(uVar130),ZEXT416(uVar67),0x10);
            auVar152 = ZEXT1664(auVar71);
            uVar56 = 0;
            while( true ) {
              bVar57 = (byte)uVar66;
              if (uVar56 == 5) break;
              uVar155 = auVar152._0_4_;
              auVar143._4_4_ = uVar155;
              auVar143._0_4_ = uVar155;
              auVar143._8_4_ = uVar155;
              auVar143._12_4_ = uVar155;
              auVar72 = vfmadd132ps_fma(auVar143,ZEXT816(0) << 0x40,local_970);
              auVar68 = auVar152._0_16_;
              auVar71 = vmovshdup_avx(auVar68);
              local_7e0._0_16_ = auVar71;
              fVar201 = 1.0 - auVar71._0_4_;
              auVar71 = vshufps_avx(auVar68,auVar68,0x55);
              fVar168 = auVar71._0_4_;
              auVar187._0_4_ = local_8a0._0_4_ * fVar168;
              fVar170 = auVar71._4_4_;
              auVar187._4_4_ = local_8a0._4_4_ * fVar170;
              fVar138 = auVar71._8_4_;
              auVar187._8_4_ = local_8a0._8_4_ * fVar138;
              fVar172 = auVar71._12_4_;
              auVar187._12_4_ = local_8a0._12_4_ * fVar172;
              _local_7c0 = ZEXT416((uint)fVar201);
              auVar209._4_4_ = fVar201;
              auVar209._0_4_ = fVar201;
              auVar209._8_4_ = fVar201;
              auVar209._12_4_ = fVar201;
              auVar71 = vfmadd231ps_fma(auVar187,auVar209,local_860._0_16_);
              auVar218._0_4_ = local_880._0_4_ * fVar168;
              auVar218._4_4_ = local_880._4_4_ * fVar170;
              auVar218._8_4_ = local_880._8_4_ * fVar138;
              auVar218._12_4_ = local_880._12_4_ * fVar172;
              auVar68 = vfmadd231ps_fma(auVar218,auVar209,local_8a0._0_16_);
              auVar225._0_4_ = fVar168 * (float)local_8c0._0_4_;
              auVar225._4_4_ = fVar170 * (float)local_8c0._4_4_;
              auVar225._8_4_ = fVar138 * fStack_8b8;
              auVar225._12_4_ = fVar172 * fStack_8b4;
              auVar76 = vfmadd231ps_fma(auVar225,auVar209,local_880._0_16_);
              auVar232._0_4_ = fVar168 * auVar68._0_4_;
              auVar232._4_4_ = fVar170 * auVar68._4_4_;
              auVar232._8_4_ = fVar138 * auVar68._8_4_;
              auVar232._12_4_ = fVar172 * auVar68._12_4_;
              auVar71 = vfmadd231ps_fma(auVar232,auVar209,auVar71);
              auVar188._0_4_ = fVar168 * auVar76._0_4_;
              auVar188._4_4_ = fVar170 * auVar76._4_4_;
              auVar188._8_4_ = fVar138 * auVar76._8_4_;
              auVar188._12_4_ = fVar172 * auVar76._12_4_;
              auVar68 = vfmadd231ps_fma(auVar188,auVar209,auVar68);
              auVar219._0_4_ = fVar168 * auVar68._0_4_;
              auVar219._4_4_ = fVar170 * auVar68._4_4_;
              auVar219._8_4_ = fVar138 * auVar68._8_4_;
              auVar219._12_4_ = fVar172 * auVar68._12_4_;
              auVar76 = vfmadd231ps_fma(auVar219,auVar71,auVar209);
              auVar71 = vsubps_avx(auVar68,auVar71);
              auVar21._8_4_ = 0x40400000;
              auVar21._0_8_ = 0x4040000040400000;
              auVar21._12_4_ = 0x40400000;
              auVar68 = vmulps_avx512vl(auVar71,auVar21);
              local_7a0._0_16_ = auVar76;
              auVar72 = vsubps_avx(auVar72,auVar76);
              auVar71 = vdpps_avx(auVar72,auVar72,0x7f);
              fVar168 = auVar71._0_4_;
              local_780 = auVar152;
              if (fVar168 < 0.0) {
                auVar241._0_4_ = sqrtf(fVar168);
                auVar241._4_60_ = extraout_var_00;
                auVar76 = auVar241._0_16_;
                uVar66 = extraout_RAX_02;
              }
              else {
                auVar76 = vsqrtss_avx(auVar71,auVar71);
              }
              local_800._0_16_ = vdpps_avx(auVar68,auVar68,0x7f);
              fVar170 = local_800._0_4_;
              auVar189._4_12_ = ZEXT812(0) << 0x20;
              auVar189._0_4_ = fVar170;
              local_9a0._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              fVar138 = local_9a0._0_4_;
              local_820._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar189);
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar69 = vxorps_avx512vl(local_800._0_16_,auVar22);
              auVar73 = vfnmadd213ss_fma(local_820._0_16_,local_800._0_16_,ZEXT416(0x40000000));
              local_840._0_4_ = auVar73._0_4_;
              local_940._0_4_ = auVar76._0_4_;
              if (fVar170 < auVar69._0_4_) {
                fVar172 = sqrtf(fVar170);
                auVar76 = ZEXT416((uint)local_940._0_4_);
                uVar66 = extraout_RAX_03;
              }
              else {
                auVar73 = vsqrtss_avx(local_800._0_16_,local_800._0_16_);
                fVar172 = auVar73._0_4_;
              }
              fVar201 = local_9a0._0_4_;
              auVar74 = vbroadcastss_avx512vl
                                  (ZEXT416((uint)(fVar138 * 1.5 +
                                                 fVar170 * -0.5 * fVar201 * fVar201 * fVar201)));
              auVar73 = vmulps_avx512vl(auVar74,auVar68);
              local_9a0._0_16_ = vdpps_avx(auVar73,auVar72,0x7f);
              auVar77 = vaddss_avx512f(auVar76,ZEXT416(0x3f800000));
              auVar144._0_4_ = local_9a0._0_4_ * local_9a0._0_4_;
              auVar144._4_4_ = local_9a0._4_4_ * local_9a0._4_4_;
              auVar144._8_4_ = local_9a0._8_4_ * local_9a0._8_4_;
              auVar144._12_4_ = local_9a0._12_4_ * local_9a0._12_4_;
              auVar71 = vsubps_avx(auVar71,auVar144);
              fVar170 = auVar71._0_4_;
              auVar159._4_12_ = ZEXT812(0) << 0x20;
              auVar159._0_4_ = fVar170;
              auVar69 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar159);
              auVar78 = vmulss_avx512f(auVar69,ZEXT416(0x3fc00000));
              auVar75 = vmulss_avx512f(auVar71,ZEXT416(0xbf000000));
              uVar65 = fVar170 == 0.0;
              uVar64 = fVar170 < 0.0;
              if ((bool)uVar64) {
                local_8e0._0_4_ = auVar78._0_4_;
                _local_900 = auVar74;
                local_8f0 = auVar73;
                local_8d0 = auVar69;
                fVar170 = sqrtf(fVar170);
                auVar75 = ZEXT416(auVar75._0_4_);
                auVar78 = ZEXT416((uint)local_8e0._0_4_);
                auVar76 = ZEXT416((uint)local_940._0_4_);
                auVar77 = ZEXT416(auVar77._0_4_);
                uVar66 = extraout_RAX_04;
                auVar73 = local_8f0;
                auVar69 = local_8d0;
                auVar74 = _local_900;
              }
              else {
                auVar71 = vsqrtss_avx(auVar71,auVar71);
                fVar170 = auVar71._0_4_;
              }
              auVar251 = ZEXT1664(auVar73);
              auVar252 = ZEXT3264(local_9c0);
              auVar247 = ZEXT3264(local_9e0);
              auVar249 = ZEXT3264(local_a00);
              auVar243 = ZEXT3264(local_a20);
              auVar230 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_7c0,local_7e0._0_16_)
              ;
              auVar71 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7e0._0_16_,_local_7c0);
              fVar138 = auVar71._0_4_ * 6.0;
              fVar201 = local_7e0._0_4_ * 6.0;
              auVar210._0_4_ = fVar201 * (float)local_8c0._0_4_;
              auVar210._4_4_ = fVar201 * (float)local_8c0._4_4_;
              auVar210._8_4_ = fVar201 * fStack_8b8;
              auVar210._12_4_ = fVar201 * fStack_8b4;
              auVar190._4_4_ = fVar138;
              auVar190._0_4_ = fVar138;
              auVar190._8_4_ = fVar138;
              auVar190._12_4_ = fVar138;
              auVar71 = vfmadd132ps_fma(auVar190,auVar210,local_880._0_16_);
              fVar138 = auVar230._0_4_ * 6.0;
              auVar160._4_4_ = fVar138;
              auVar160._0_4_ = fVar138;
              auVar160._8_4_ = fVar138;
              auVar160._12_4_ = fVar138;
              auVar71 = vfmadd132ps_fma(auVar160,auVar71,local_8a0._0_16_);
              fVar138 = local_7c0._0_4_ * 6.0;
              auVar191._4_4_ = fVar138;
              auVar191._0_4_ = fVar138;
              auVar191._8_4_ = fVar138;
              auVar191._12_4_ = fVar138;
              auVar71 = vfmadd132ps_fma(auVar191,auVar71,local_860._0_16_);
              auVar161._0_4_ = auVar71._0_4_ * (float)local_800._0_4_;
              auVar161._4_4_ = auVar71._4_4_ * (float)local_800._0_4_;
              auVar161._8_4_ = auVar71._8_4_ * (float)local_800._0_4_;
              auVar161._12_4_ = auVar71._12_4_ * (float)local_800._0_4_;
              auVar71 = vdpps_avx(auVar68,auVar71,0x7f);
              fVar138 = auVar71._0_4_;
              auVar192._0_4_ = auVar68._0_4_ * fVar138;
              auVar192._4_4_ = auVar68._4_4_ * fVar138;
              auVar192._8_4_ = auVar68._8_4_ * fVar138;
              auVar192._12_4_ = auVar68._12_4_ * fVar138;
              auVar71 = vsubps_avx(auVar161,auVar192);
              fVar138 = (float)local_840._0_4_ * (float)local_820._0_4_;
              auVar230 = vmaxss_avx(ZEXT416((uint)fVar166),
                                    ZEXT416((uint)(local_780._0_4_ * fVar153 * 1.9073486e-06)));
              auVar193._0_4_ = auVar71._0_4_ * fVar138;
              auVar193._4_4_ = auVar71._4_4_ * fVar138;
              auVar193._8_4_ = auVar71._8_4_ * fVar138;
              auVar193._12_4_ = auVar71._12_4_ * fVar138;
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar79 = vxorps_avx512vl(auVar68,auVar23);
              auVar80 = vmulps_avx512vl(auVar74,auVar193);
              auVar71 = vdpps_avx(auVar79,auVar73,0x7f);
              auVar74 = vfmadd213ss_fma(auVar76,ZEXT416((uint)fVar166),auVar230);
              auVar76 = vdpps_avx(auVar72,auVar80,0x7f);
              vfmadd213ss_avx512f(auVar77,ZEXT416((uint)(fVar166 / fVar172)),auVar74);
              fVar138 = auVar71._0_4_ + auVar76._0_4_;
              auVar71 = vdpps_avx(local_970,auVar73,0x7f);
              auVar76 = vdpps_avx(auVar72,auVar79,0x7f);
              auVar74 = vmulss_avx512f(auVar75,auVar69);
              auVar69 = vmulss_avx512f(auVar69,auVar69);
              auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar74._0_4_ * auVar69._0_4_)));
              auVar69 = vdpps_avx(auVar72,local_970,0x7f);
              auVar77 = vfnmadd231ss_fma(auVar76,local_9a0._0_16_,ZEXT416((uint)fVar138));
              auVar69 = vfnmadd231ss_fma(auVar69,local_9a0._0_16_,auVar71);
              auVar76 = vpermilps_avx(local_7a0._0_16_,0xff);
              fVar170 = fVar170 - auVar76._0_4_;
              auVar74 = vshufps_avx(auVar68,auVar68,0xff);
              auVar76 = vfmsub213ss_fma(auVar77,auVar78,auVar74);
              auVar237._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
              auVar237._8_4_ = auVar76._8_4_ ^ 0x80000000;
              auVar237._12_4_ = auVar76._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar69._0_4_ * auVar78._0_4_));
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar76._0_4_)),
                                        ZEXT416((uint)fVar138),auVar69);
              auVar76 = vinsertps_avx(auVar237,auVar69,0x1c);
              auVar226._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
              auVar226._8_4_ = auVar71._8_4_ ^ 0x80000000;
              auVar226._12_4_ = auVar71._12_4_ ^ 0x80000000;
              auVar69 = vinsertps_avx(ZEXT416((uint)fVar138),auVar226,0x10);
              auVar211._0_4_ = auVar77._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar71 = vdivps_avx(auVar76,auVar211);
              auVar76 = vdivps_avx(auVar69,auVar211);
              fVar138 = local_9a0._0_4_;
              auVar212._0_4_ = fVar138 * auVar71._0_4_ + fVar170 * auVar76._0_4_;
              auVar212._4_4_ = fVar138 * auVar71._4_4_ + fVar170 * auVar76._4_4_;
              auVar212._8_4_ = fVar138 * auVar71._8_4_ + fVar170 * auVar76._8_4_;
              auVar212._12_4_ = fVar138 * auVar71._12_4_ + fVar170 * auVar76._12_4_;
              auVar71 = vsubps_avx(local_780._0_16_,auVar212);
              auVar152 = ZEXT1664(auVar71);
              auVar24._8_4_ = 0x7fffffff;
              auVar24._0_8_ = 0x7fffffff7fffffff;
              auVar24._12_4_ = 0x7fffffff;
              auVar76 = vandps_avx512vl(local_9a0._0_16_,auVar24);
              auVar76 = vucomiss_avx512f(auVar76);
              if (!(bool)uVar64 && !(bool)uVar65) {
                auVar76 = vaddss_avx512f(auVar230,auVar76);
                auVar76 = vfmadd231ss_fma(auVar76,local_910,ZEXT416(0x36000000));
                auVar25._8_4_ = 0x7fffffff;
                auVar25._0_8_ = 0x7fffffff7fffffff;
                auVar25._12_4_ = 0x7fffffff;
                auVar69 = vandps_avx512vl(ZEXT416((uint)fVar170),auVar25);
                if (auVar69._0_4_ < auVar76._0_4_) {
                  bVar63 = uVar56 < 5;
                  fVar153 = auVar71._0_4_ + (float)local_920._0_4_;
                  auVar235 = ZEXT3264(local_a40);
                  auVar239 = ZEXT3264(local_a60);
                  auVar241 = ZEXT3264(local_a80);
                  if ((fVar250 <= fVar153) &&
                     (fVar166 = *(float *)(ray + k * 4 + 0x200), fVar153 <= fVar166)) {
                    auVar71 = vmovshdup_avx(auVar71);
                    bVar57 = 0;
                    if ((auVar71._0_4_ < 0.0) || (1.0 < auVar71._0_4_)) goto LAB_019ae796;
                    auVar213._0_12_ = ZEXT812(0);
                    auVar213._12_4_ = 0;
                    auVar194._4_8_ = auVar213._4_8_;
                    auVar194._0_4_ = fVar168;
                    auVar194._12_4_ = 0;
                    auVar71 = vrsqrt14ss_avx512f(auVar213,auVar194);
                    fVar170 = auVar71._0_4_;
                    pGVar2 = (context->scene->geometries).items[uVar1].ptr;
                    if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar57 = 1, pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_019ae796;
                      fVar168 = fVar170 * 1.5 + fVar168 * -0.5 * fVar170 * fVar170 * fVar170;
                      local_b60 = auVar72._0_4_;
                      fStack_b5c = auVar72._4_4_;
                      fStack_b58 = auVar72._8_4_;
                      fStack_b54 = auVar72._12_4_;
                      auVar195._0_4_ = fVar168 * local_b60;
                      auVar195._4_4_ = fVar168 * fStack_b5c;
                      auVar195._8_4_ = fVar168 * fStack_b58;
                      auVar195._12_4_ = fVar168 * fStack_b54;
                      auVar76 = vfmadd213ps_fma(auVar74,auVar195,auVar68);
                      auVar71 = vshufps_avx(auVar195,auVar195,0xc9);
                      auVar72 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar196._0_4_ = auVar195._0_4_ * auVar72._0_4_;
                      auVar196._4_4_ = auVar195._4_4_ * auVar72._4_4_;
                      auVar196._8_4_ = auVar195._8_4_ * auVar72._8_4_;
                      auVar196._12_4_ = auVar195._12_4_ * auVar72._12_4_;
                      auVar68 = vfmsub231ps_fma(auVar196,auVar68,auVar71);
                      auVar71 = vshufps_avx(auVar68,auVar68,0xc9);
                      auVar72 = vshufps_avx(auVar76,auVar76,0xc9);
                      auVar68 = vshufps_avx(auVar68,auVar68,0xd2);
                      auVar145._0_4_ = auVar76._0_4_ * auVar68._0_4_;
                      auVar145._4_4_ = auVar76._4_4_ * auVar68._4_4_;
                      auVar145._8_4_ = auVar76._8_4_ * auVar68._8_4_;
                      auVar145._12_4_ = auVar76._12_4_ * auVar68._12_4_;
                      auVar71 = vfmsub231ps_fma(auVar145,auVar71,auVar72);
                      auVar254 = vbroadcastss_avx512f(ZEXT416(1));
                      local_340 = vpermps_avx512f(auVar254,auVar152);
                      auVar152 = vpermps_avx512f(auVar254,ZEXT1664(auVar71));
                      auVar254 = vbroadcastss_avx512f(ZEXT416(2));
                      local_3c0 = vpermps_avx512f(auVar254,ZEXT1664(auVar71));
                      local_380 = vbroadcastss_avx512f(auVar71);
                      local_400[0] = (RTCHitN)auVar152[0];
                      local_400[1] = (RTCHitN)auVar152[1];
                      local_400[2] = (RTCHitN)auVar152[2];
                      local_400[3] = (RTCHitN)auVar152[3];
                      local_400[4] = (RTCHitN)auVar152[4];
                      local_400[5] = (RTCHitN)auVar152[5];
                      local_400[6] = (RTCHitN)auVar152[6];
                      local_400[7] = (RTCHitN)auVar152[7];
                      local_400[8] = (RTCHitN)auVar152[8];
                      local_400[9] = (RTCHitN)auVar152[9];
                      local_400[10] = (RTCHitN)auVar152[10];
                      local_400[0xb] = (RTCHitN)auVar152[0xb];
                      local_400[0xc] = (RTCHitN)auVar152[0xc];
                      local_400[0xd] = (RTCHitN)auVar152[0xd];
                      local_400[0xe] = (RTCHitN)auVar152[0xe];
                      local_400[0xf] = (RTCHitN)auVar152[0xf];
                      local_400[0x10] = (RTCHitN)auVar152[0x10];
                      local_400[0x11] = (RTCHitN)auVar152[0x11];
                      local_400[0x12] = (RTCHitN)auVar152[0x12];
                      local_400[0x13] = (RTCHitN)auVar152[0x13];
                      local_400[0x14] = (RTCHitN)auVar152[0x14];
                      local_400[0x15] = (RTCHitN)auVar152[0x15];
                      local_400[0x16] = (RTCHitN)auVar152[0x16];
                      local_400[0x17] = (RTCHitN)auVar152[0x17];
                      local_400[0x18] = (RTCHitN)auVar152[0x18];
                      local_400[0x19] = (RTCHitN)auVar152[0x19];
                      local_400[0x1a] = (RTCHitN)auVar152[0x1a];
                      local_400[0x1b] = (RTCHitN)auVar152[0x1b];
                      local_400[0x1c] = (RTCHitN)auVar152[0x1c];
                      local_400[0x1d] = (RTCHitN)auVar152[0x1d];
                      local_400[0x1e] = (RTCHitN)auVar152[0x1e];
                      local_400[0x1f] = (RTCHitN)auVar152[0x1f];
                      local_400[0x20] = (RTCHitN)auVar152[0x20];
                      local_400[0x21] = (RTCHitN)auVar152[0x21];
                      local_400[0x22] = (RTCHitN)auVar152[0x22];
                      local_400[0x23] = (RTCHitN)auVar152[0x23];
                      local_400[0x24] = (RTCHitN)auVar152[0x24];
                      local_400[0x25] = (RTCHitN)auVar152[0x25];
                      local_400[0x26] = (RTCHitN)auVar152[0x26];
                      local_400[0x27] = (RTCHitN)auVar152[0x27];
                      local_400[0x28] = (RTCHitN)auVar152[0x28];
                      local_400[0x29] = (RTCHitN)auVar152[0x29];
                      local_400[0x2a] = (RTCHitN)auVar152[0x2a];
                      local_400[0x2b] = (RTCHitN)auVar152[0x2b];
                      local_400[0x2c] = (RTCHitN)auVar152[0x2c];
                      local_400[0x2d] = (RTCHitN)auVar152[0x2d];
                      local_400[0x2e] = (RTCHitN)auVar152[0x2e];
                      local_400[0x2f] = (RTCHitN)auVar152[0x2f];
                      local_400[0x30] = (RTCHitN)auVar152[0x30];
                      local_400[0x31] = (RTCHitN)auVar152[0x31];
                      local_400[0x32] = (RTCHitN)auVar152[0x32];
                      local_400[0x33] = (RTCHitN)auVar152[0x33];
                      local_400[0x34] = (RTCHitN)auVar152[0x34];
                      local_400[0x35] = (RTCHitN)auVar152[0x35];
                      local_400[0x36] = (RTCHitN)auVar152[0x36];
                      local_400[0x37] = (RTCHitN)auVar152[0x37];
                      local_400[0x38] = (RTCHitN)auVar152[0x38];
                      local_400[0x39] = (RTCHitN)auVar152[0x39];
                      local_400[0x3a] = (RTCHitN)auVar152[0x3a];
                      local_400[0x3b] = (RTCHitN)auVar152[0x3b];
                      local_400[0x3c] = (RTCHitN)auVar152[0x3c];
                      local_400[0x3d] = (RTCHitN)auVar152[0x3d];
                      local_400[0x3e] = (RTCHitN)auVar152[0x3e];
                      local_400[0x3f] = (RTCHitN)auVar152[0x3f];
                      local_300 = 0;
                      uStack_2f8 = 0;
                      uStack_2f0 = 0;
                      uStack_2e8 = 0;
                      uStack_2e0 = 0;
                      uStack_2d8 = 0;
                      uStack_2d0 = 0;
                      uStack_2c8 = 0;
                      local_2c0 = local_480._0_8_;
                      uStack_2b8 = local_480._8_8_;
                      uStack_2b0 = local_480._16_8_;
                      uStack_2a8 = local_480._24_8_;
                      uStack_2a0 = local_480._32_8_;
                      uStack_298 = local_480._40_8_;
                      uStack_290 = local_480._48_8_;
                      uStack_288 = local_480._56_8_;
                      auVar152 = vmovdqa64_avx512f(local_4c0);
                      local_280 = vmovdqa64_avx512f(auVar152);
                      vpcmpeqd_avx2(auVar152._0_32_,auVar152._0_32_);
                      local_240 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                      local_200 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]));
                      *(float *)(ray + k * 4 + 0x200) = fVar153;
                      auVar152 = vmovdqa64_avx512f(local_500);
                      local_6c0 = vmovdqa64_avx512f(auVar152);
                      local_ab0.valid = (int *)local_6c0;
                      local_ab0.geometryUserPtr = pGVar2->userPtr;
                      local_ab0.context = context->user;
                      local_ab0.hit = local_400;
                      local_ab0.N = 0x10;
                      local_780._0_4_ = fVar166;
                      local_ab0.ray = (RTCRayN *)ray;
                      if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar251 = ZEXT1664(auVar73);
                        (*pGVar2->occlusionFilterN)(&local_ab0);
                        auVar241 = ZEXT3264(local_a80);
                        auVar239 = ZEXT3264(local_a60);
                        auVar235 = ZEXT3264(local_a40);
                        auVar243 = ZEXT3264(local_a20);
                        auVar249 = ZEXT3264(local_a00);
                        auVar247 = ZEXT3264(local_9e0);
                        auVar252 = ZEXT3264(local_9c0);
                        auVar152 = vmovdqa64_avx512f(local_6c0);
                        fVar166 = (float)local_780._0_4_;
                      }
                      uVar12 = vptestmd_avx512f(auVar152,auVar152);
                      if ((short)uVar12 != 0) {
                        p_Var3 = context->args->filter;
                        if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar251 = ZEXT1664(auVar251._0_16_);
                          (*p_Var3)(&local_ab0);
                          auVar241 = ZEXT3264(local_a80);
                          auVar239 = ZEXT3264(local_a60);
                          auVar235 = ZEXT3264(local_a40);
                          auVar243 = ZEXT3264(local_a20);
                          auVar249 = ZEXT3264(local_a00);
                          auVar247 = ZEXT3264(local_9e0);
                          auVar252 = ZEXT3264(local_9c0);
                          auVar152 = vmovdqa64_avx512f(local_6c0);
                          fVar166 = (float)local_780._0_4_;
                        }
                        uVar66 = vptestmd_avx512f(auVar152,auVar152);
                        auVar152 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                        bVar4 = (bool)((byte)uVar66 & 1);
                        auVar254._0_4_ =
                             (uint)bVar4 * auVar152._0_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x200);
                        bVar4 = (bool)((byte)(uVar66 >> 1) & 1);
                        auVar254._4_4_ =
                             (uint)bVar4 * auVar152._4_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x204);
                        bVar4 = (bool)((byte)(uVar66 >> 2) & 1);
                        auVar254._8_4_ =
                             (uint)bVar4 * auVar152._8_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x208);
                        bVar4 = (bool)((byte)(uVar66 >> 3) & 1);
                        auVar254._12_4_ =
                             (uint)bVar4 * auVar152._12_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x20c);
                        bVar4 = (bool)((byte)(uVar66 >> 4) & 1);
                        auVar254._16_4_ =
                             (uint)bVar4 * auVar152._16_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x210);
                        bVar4 = (bool)((byte)(uVar66 >> 5) & 1);
                        auVar254._20_4_ =
                             (uint)bVar4 * auVar152._20_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x214);
                        bVar4 = (bool)((byte)(uVar66 >> 6) & 1);
                        auVar254._24_4_ =
                             (uint)bVar4 * auVar152._24_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x218);
                        bVar4 = (bool)((byte)(uVar66 >> 7) & 1);
                        auVar254._28_4_ =
                             (uint)bVar4 * auVar152._28_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x21c);
                        bVar4 = (bool)((byte)(uVar66 >> 8) & 1);
                        auVar254._32_4_ =
                             (uint)bVar4 * auVar152._32_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x220);
                        bVar4 = (bool)((byte)(uVar66 >> 9) & 1);
                        auVar254._36_4_ =
                             (uint)bVar4 * auVar152._36_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x224);
                        bVar4 = (bool)((byte)(uVar66 >> 10) & 1);
                        auVar254._40_4_ =
                             (uint)bVar4 * auVar152._40_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x228);
                        bVar4 = (bool)((byte)(uVar66 >> 0xb) & 1);
                        auVar254._44_4_ =
                             (uint)bVar4 * auVar152._44_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x22c);
                        bVar4 = (bool)((byte)(uVar66 >> 0xc) & 1);
                        auVar254._48_4_ =
                             (uint)bVar4 * auVar152._48_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x230);
                        bVar4 = (bool)((byte)(uVar66 >> 0xd) & 1);
                        auVar254._52_4_ =
                             (uint)bVar4 * auVar152._52_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x234);
                        bVar4 = (bool)((byte)(uVar66 >> 0xe) & 1);
                        auVar254._56_4_ =
                             (uint)bVar4 * auVar152._56_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x238);
                        bVar4 = SUB81(uVar66 >> 0xf,0);
                        auVar254._60_4_ =
                             (uint)bVar4 * auVar152._60_4_ |
                             (uint)!bVar4 * *(int *)(local_ab0.ray + 0x23c);
                        *(undefined1 (*) [64])(local_ab0.ray + 0x200) = auVar254;
                        bVar57 = 1;
                        if ((short)uVar66 != 0) goto LAB_019ae796;
                      }
                      *(float *)(ray + k * 4 + 0x200) = fVar166;
                    }
                  }
                  bVar57 = 0;
                  goto LAB_019ae796;
                }
              }
              uVar56 = uVar56 + 1;
              auVar235 = ZEXT3264(local_a40);
              auVar239 = ZEXT3264(local_a60);
              auVar241 = ZEXT3264(local_a80);
            }
            bVar63 = false;
LAB_019ae796:
            bVar62 = bVar62 | bVar63 & bVar57;
            uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar229._4_4_ = uVar155;
            auVar229._0_4_ = uVar155;
            auVar229._8_4_ = uVar155;
            auVar229._12_4_ = uVar155;
            auVar229._16_4_ = uVar155;
            auVar229._20_4_ = uVar155;
            auVar229._24_4_ = uVar155;
            auVar229._28_4_ = uVar155;
            auVar152 = ZEXT3264(auVar229);
            auVar48._4_4_ = fStack_65c;
            auVar48._0_4_ = local_660;
            auVar48._8_4_ = fStack_658;
            auVar48._12_4_ = fStack_654;
            auVar48._16_4_ = fStack_650;
            auVar48._20_4_ = fStack_64c;
            auVar48._24_4_ = fStack_648;
            auVar48._28_4_ = fStack_644;
            uVar12 = vcmpps_avx512vl(auVar229,auVar48,0xd);
          }
          uVar14 = vpcmpd_avx512vl(local_620,local_5c0,1);
          uVar13 = vpcmpd_avx512vl(local_620,_local_680,1);
          auVar163._0_4_ = (float)local_960._0_4_ + (float)local_440._0_4_;
          auVar163._4_4_ = (float)local_960._4_4_ + (float)local_440._4_4_;
          auVar163._8_4_ = fStack_958 + fStack_438;
          auVar163._12_4_ = fStack_954 + fStack_434;
          auVar163._16_4_ = fStack_950 + fStack_430;
          auVar163._20_4_ = fStack_94c + fStack_42c;
          auVar163._24_4_ = fStack_948 + fStack_428;
          auVar163._28_4_ = fStack_944 + fStack_424;
          uVar155 = auVar152._0_4_;
          auVar199._4_4_ = uVar155;
          auVar199._0_4_ = uVar155;
          auVar199._8_4_ = uVar155;
          auVar199._12_4_ = uVar155;
          auVar199._16_4_ = uVar155;
          auVar199._20_4_ = uVar155;
          auVar199._24_4_ = uVar155;
          auVar199._28_4_ = uVar155;
          uVar12 = vcmpps_avx512vl(auVar163,auVar199,2);
          bVar55 = bVar55 & (byte)uVar14 & (byte)uVar12;
          auVar215._0_4_ = (float)local_960._0_4_ + (float)local_600._0_4_;
          auVar215._4_4_ = (float)local_960._4_4_ + (float)local_600._4_4_;
          auVar215._8_4_ = fStack_958 + fStack_5f8;
          auVar215._12_4_ = fStack_954 + fStack_5f4;
          auVar215._16_4_ = fStack_950 + fStack_5f0;
          auVar215._20_4_ = fStack_94c + fStack_5ec;
          auVar215._24_4_ = fStack_948 + fStack_5e8;
          auVar215._28_4_ = fStack_944 + fStack_5e4;
          uVar12 = vcmpps_avx512vl(auVar215,auVar199,2);
          bVar50 = bVar50 & (byte)uVar13 & (byte)uVar12 | bVar55;
          if (bVar50 != 0) {
            abStack_1a0[uVar54 * 0x60] = bVar50;
            bVar63 = (bool)(bVar55 >> 1 & 1);
            bVar4 = (bool)(bVar55 >> 2 & 1);
            bVar5 = (bool)(bVar55 >> 3 & 1);
            bVar6 = (bool)(bVar55 >> 4 & 1);
            bVar7 = (bool)(bVar55 >> 5 & 1);
            auStack_180[uVar54 * 0x18] =
                 (uint)(bVar55 & 1) * local_440._0_4_ | (uint)!(bool)(bVar55 & 1) * local_600._0_4_;
            auStack_180[uVar54 * 0x18 + 1] =
                 (uint)bVar63 * local_440._4_4_ | (uint)!bVar63 * local_600._4_4_;
            auStack_180[uVar54 * 0x18 + 2] =
                 (uint)bVar4 * (int)fStack_438 | (uint)!bVar4 * (int)fStack_5f8;
            auStack_180[uVar54 * 0x18 + 3] =
                 (uint)bVar5 * (int)fStack_434 | (uint)!bVar5 * (int)fStack_5f4;
            auStack_180[uVar54 * 0x18 + 4] =
                 (uint)bVar6 * (int)fStack_430 | (uint)!bVar6 * (int)fStack_5f0;
            auStack_180[uVar54 * 0x18 + 5] =
                 (uint)bVar7 * (int)fStack_42c | (uint)!bVar7 * (int)fStack_5ec;
            auStack_180[uVar54 * 0x18 + 6] =
                 (uint)(bVar55 >> 6) * (int)fStack_428 |
                 (uint)!(bool)(bVar55 >> 6) * (int)fStack_5e8;
            (&fStack_164)[uVar54 * 0x18] = fStack_5e4;
            uVar66 = vmovlps_avx(local_630);
            (&uStack_160)[uVar54 * 0xc] = uVar66;
            aiStack_158[uVar54 * 0x18] = iVar61 + 1;
            uVar54 = (ulong)((int)uVar54 + 1);
          }
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar254 = ZEXT3264(auVar93);
          auVar152 = ZEXT3264(_DAT_01f7b040);
          fVar153 = (float)local_960._0_4_;
          fVar166 = (float)local_960._4_4_;
          fVar168 = fStack_958;
          fVar170 = fStack_954;
          fVar138 = fStack_950;
          fVar172 = fStack_94c;
          fVar201 = fStack_948;
          fVar175 = fStack_944;
        }
      }
    }
    do {
      uVar67 = (uint)uVar54;
      uVar54 = (ulong)(uVar67 - 1);
      if (uVar67 == 0) {
        if (bVar62 != 0) goto LAB_019aee87;
        uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar32._4_4_ = uVar155;
        auVar32._0_4_ = uVar155;
        auVar32._8_4_ = uVar155;
        auVar32._12_4_ = uVar155;
        auVar32._16_4_ = uVar155;
        auVar32._20_4_ = uVar155;
        auVar32._24_4_ = uVar155;
        auVar32._28_4_ = uVar155;
        uVar12 = vcmpps_avx512vl(local_5a0,auVar32,2);
        uVar59 = (ulong)((uint)uVar58 & (uint)uVar12);
        goto LAB_019ac556;
      }
      auVar93 = *(undefined1 (*) [32])(auStack_180 + uVar54 * 0x18);
      auVar164._0_4_ = fVar153 + auVar93._0_4_;
      auVar164._4_4_ = fVar166 + auVar93._4_4_;
      auVar164._8_4_ = fVar168 + auVar93._8_4_;
      auVar164._12_4_ = fVar170 + auVar93._12_4_;
      auVar164._16_4_ = fVar138 + auVar93._16_4_;
      auVar164._20_4_ = fVar172 + auVar93._20_4_;
      auVar164._24_4_ = fVar201 + auVar93._24_4_;
      auVar164._28_4_ = fVar175 + auVar93._28_4_;
      uVar155 = *(undefined4 *)(ray + k * 4 + 0x200);
      auVar31._4_4_ = uVar155;
      auVar31._0_4_ = uVar155;
      auVar31._8_4_ = uVar155;
      auVar31._12_4_ = uVar155;
      auVar31._16_4_ = uVar155;
      auVar31._20_4_ = uVar155;
      auVar31._24_4_ = uVar155;
      auVar31._28_4_ = uVar155;
      uVar12 = vcmpps_avx512vl(auVar164,auVar31,2);
      uVar130 = (uint)uVar12 & (uint)abStack_1a0[uVar54 * 0x60];
    } while (uVar130 == 0);
    uVar66 = (&uStack_160)[uVar54 * 0xc];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = uVar66;
    auVar200._8_4_ = 0x7f800000;
    auVar200._0_8_ = 0x7f8000007f800000;
    auVar200._12_4_ = 0x7f800000;
    auVar200._16_4_ = 0x7f800000;
    auVar200._20_4_ = 0x7f800000;
    auVar200._24_4_ = 0x7f800000;
    auVar200._28_4_ = 0x7f800000;
    auVar94 = vblendmps_avx512vl(auVar200,auVar93);
    bVar50 = (byte)uVar130;
    auVar129._0_4_ =
         (uint)(bVar50 & 1) * auVar94._0_4_ | (uint)!(bool)(bVar50 & 1) * (int)auVar93._0_4_;
    bVar63 = (bool)((byte)(uVar130 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar63 * auVar94._4_4_ | (uint)!bVar63 * (int)auVar93._4_4_;
    bVar63 = (bool)((byte)(uVar130 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar63 * auVar94._8_4_ | (uint)!bVar63 * (int)auVar93._8_4_;
    bVar63 = (bool)((byte)(uVar130 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar63 * auVar94._12_4_ | (uint)!bVar63 * (int)auVar93._12_4_;
    bVar63 = (bool)((byte)(uVar130 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar63 * auVar94._16_4_ | (uint)!bVar63 * (int)auVar93._16_4_;
    bVar63 = (bool)((byte)(uVar130 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar63 * auVar94._20_4_ | (uint)!bVar63 * (int)auVar93._20_4_;
    bVar63 = (bool)((byte)(uVar130 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar63 * auVar94._24_4_ | (uint)!bVar63 * (int)auVar93._24_4_;
    auVar129._28_4_ =
         (uVar130 >> 7) * auVar94._28_4_ | (uint)!SUB41(uVar130 >> 7,0) * (int)auVar93._28_4_;
    auVar93 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar93 = vminps_avx(auVar129,auVar93);
    auVar94 = vshufpd_avx(auVar93,auVar93,5);
    auVar93 = vminps_avx(auVar93,auVar94);
    auVar94 = vpermpd_avx2(auVar93,0x4e);
    auVar93 = vminps_avx(auVar93,auVar94);
    uVar12 = vcmpps_avx512vl(auVar129,auVar93,0);
    bVar60 = (byte)uVar12 & bVar50;
    if (bVar60 != 0) {
      uVar130 = (uint)bVar60;
    }
    uVar131 = 0;
    for (; (uVar130 & 1) == 0; uVar130 = uVar130 >> 1 | 0x80000000) {
      uVar131 = uVar131 + 1;
    }
    iVar61 = aiStack_158[uVar54 * 0x18];
    bVar50 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar50;
    abStack_1a0[uVar54 * 0x60] = bVar50;
    if (bVar50 == 0) {
      uVar67 = uVar67 - 1;
    }
    uVar155 = (undefined4)uVar66;
    auVar151._4_4_ = uVar155;
    auVar151._0_4_ = uVar155;
    auVar151._8_4_ = uVar155;
    auVar151._12_4_ = uVar155;
    auVar151._16_4_ = uVar155;
    auVar151._20_4_ = uVar155;
    auVar151._24_4_ = uVar155;
    auVar151._28_4_ = uVar155;
    auVar71 = vmovshdup_avx(auVar80);
    auVar71 = vsubps_avx(auVar71,auVar80);
    auVar165._0_4_ = auVar71._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar71 = vfmadd132ps_fma(auVar165,auVar151,auVar152._0_32_);
    auVar93 = ZEXT1632(auVar71);
    local_400[0] = (RTCHitN)auVar93[0];
    local_400[1] = (RTCHitN)auVar93[1];
    local_400[2] = (RTCHitN)auVar93[2];
    local_400[3] = (RTCHitN)auVar93[3];
    local_400[4] = (RTCHitN)auVar93[4];
    local_400[5] = (RTCHitN)auVar93[5];
    local_400[6] = (RTCHitN)auVar93[6];
    local_400[7] = (RTCHitN)auVar93[7];
    local_400[8] = (RTCHitN)auVar93[8];
    local_400[9] = (RTCHitN)auVar93[9];
    local_400[10] = (RTCHitN)auVar93[10];
    local_400[0xb] = (RTCHitN)auVar93[0xb];
    local_400[0xc] = (RTCHitN)auVar93[0xc];
    local_400[0xd] = (RTCHitN)auVar93[0xd];
    local_400[0xe] = (RTCHitN)auVar93[0xe];
    local_400[0xf] = (RTCHitN)auVar93[0xf];
    local_400[0x10] = (RTCHitN)auVar93[0x10];
    local_400[0x11] = (RTCHitN)auVar93[0x11];
    local_400[0x12] = (RTCHitN)auVar93[0x12];
    local_400[0x13] = (RTCHitN)auVar93[0x13];
    local_400[0x14] = (RTCHitN)auVar93[0x14];
    local_400[0x15] = (RTCHitN)auVar93[0x15];
    local_400[0x16] = (RTCHitN)auVar93[0x16];
    local_400[0x17] = (RTCHitN)auVar93[0x17];
    local_400[0x18] = (RTCHitN)auVar93[0x18];
    local_400[0x19] = (RTCHitN)auVar93[0x19];
    local_400[0x1a] = (RTCHitN)auVar93[0x1a];
    local_400[0x1b] = (RTCHitN)auVar93[0x1b];
    local_400[0x1c] = (RTCHitN)auVar93[0x1c];
    local_400[0x1d] = (RTCHitN)auVar93[0x1d];
    local_400[0x1e] = (RTCHitN)auVar93[0x1e];
    local_400[0x1f] = (RTCHitN)auVar93[0x1f];
    local_630._8_8_ = 0;
    local_630._0_8_ = *(ulong *)(local_400 + (ulong)uVar131 * 4);
    uVar54 = (ulong)uVar67;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersectorK<M,K>::intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }